

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# curveNi_mb_intersector.h
# Opt level: O2

bool embree::avx2::CurveNiMBIntersectorK<4,8>::
     occluded_n<embree::avx2::OrientedCurve1IntersectorK<embree::BSplineCurveT,8>,embree::avx2::Occluded1KEpilog1<8,true>>
               (Precalculations *pre,RayK<8> *ray,size_t k,RayQueryContext *context,Primitive *prim)

{
  long lVar1;
  long lVar2;
  undefined1 (*pauVar3) [16];
  float *pfVar4;
  undefined1 (*pauVar5) [12];
  anon_union_16_2_47237d3f_for_Vec3fa_0 aVar6;
  Primitive PVar7;
  Geometry *pGVar8;
  __int_type_conflict _Var9;
  long lVar10;
  long lVar11;
  long lVar12;
  long lVar13;
  RTCFilterFunctionN p_Var14;
  undefined1 auVar15 [16];
  undefined1 auVar16 [32];
  undefined1 auVar17 [16];
  undefined1 auVar18 [16];
  undefined1 auVar19 [16];
  undefined1 auVar20 [16];
  undefined1 auVar21 [16];
  undefined1 auVar22 [16];
  undefined1 auVar23 [16];
  undefined1 auVar24 [32];
  undefined1 auVar25 [32];
  undefined1 auVar26 [32];
  undefined1 auVar27 [32];
  undefined1 auVar28 [32];
  undefined1 auVar29 [32];
  undefined1 auVar30 [32];
  undefined1 auVar31 [32];
  undefined1 auVar32 [32];
  undefined1 auVar33 [32];
  undefined1 auVar34 [32];
  undefined1 auVar35 [32];
  undefined1 auVar36 [32];
  undefined1 auVar37 [32];
  undefined1 auVar38 [32];
  undefined1 auVar39 [32];
  undefined1 auVar40 [32];
  undefined1 auVar41 [32];
  undefined1 auVar42 [32];
  undefined1 auVar43 [32];
  undefined1 auVar44 [32];
  undefined1 auVar45 [32];
  undefined1 auVar46 [32];
  undefined1 auVar47 [32];
  undefined1 auVar48 [32];
  undefined1 auVar49 [32];
  undefined1 auVar50 [32];
  undefined1 auVar51 [32];
  undefined1 auVar52 [32];
  undefined1 auVar53 [32];
  undefined1 auVar54 [12];
  int iVar55;
  uint uVar56;
  uint uVar57;
  ulong uVar58;
  byte bVar60;
  uint uVar61;
  ulong uVar62;
  ulong uVar63;
  uint uVar64;
  long lVar65;
  long lVar66;
  undefined4 uVar67;
  bool bVar68;
  float fVar69;
  float fVar95;
  vint4 ai;
  undefined1 auVar70 [16];
  undefined1 auVar71 [16];
  undefined1 auVar72 [16];
  undefined1 auVar73 [16];
  undefined1 auVar74 [16];
  undefined1 auVar75 [16];
  undefined1 auVar76 [16];
  undefined1 auVar77 [16];
  undefined1 auVar78 [16];
  undefined1 auVar79 [16];
  float fVar96;
  undefined1 auVar80 [16];
  undefined1 auVar81 [16];
  undefined1 auVar82 [16];
  undefined1 auVar83 [16];
  undefined1 auVar84 [16];
  undefined1 auVar85 [16];
  undefined1 auVar86 [16];
  undefined1 auVar87 [16];
  undefined1 auVar88 [16];
  undefined1 auVar89 [16];
  undefined1 auVar90 [16];
  float fVar97;
  undefined1 auVar91 [32];
  undefined1 auVar92 [32];
  undefined1 auVar93 [32];
  undefined1 auVar94 [32];
  float fVar98;
  undefined8 uVar99;
  vint4 bi_2;
  undefined1 auVar100 [16];
  undefined1 auVar101 [16];
  undefined1 auVar102 [16];
  undefined1 auVar103 [16];
  undefined1 auVar104 [16];
  undefined1 auVar105 [16];
  undefined1 auVar106 [16];
  undefined1 auVar107 [16];
  undefined1 auVar108 [16];
  undefined1 auVar109 [16];
  undefined1 auVar110 [16];
  undefined1 auVar111 [16];
  undefined1 auVar112 [16];
  undefined1 auVar113 [16];
  undefined1 auVar114 [16];
  undefined1 auVar115 [16];
  undefined1 auVar116 [16];
  undefined1 auVar117 [16];
  undefined1 auVar118 [16];
  undefined1 auVar119 [16];
  undefined1 auVar120 [16];
  undefined1 auVar121 [16];
  undefined1 auVar122 [16];
  undefined1 auVar123 [32];
  undefined1 auVar124 [32];
  undefined1 auVar125 [32];
  undefined1 auVar126 [32];
  undefined1 auVar127 [32];
  float fVar128;
  float fVar142;
  float fVar143;
  undefined1 auVar129 [16];
  undefined1 auVar130 [16];
  float fVar144;
  undefined1 auVar131 [16];
  undefined1 auVar132 [16];
  undefined1 auVar133 [16];
  undefined1 auVar134 [16];
  undefined1 auVar135 [16];
  undefined1 auVar136 [16];
  undefined1 auVar137 [16];
  undefined1 auVar138 [16];
  undefined1 auVar139 [16];
  undefined1 auVar140 [16];
  undefined1 auVar141 [16];
  float fVar145;
  float fVar146;
  vint4 bi_1;
  undefined1 auVar147 [16];
  undefined1 auVar148 [16];
  undefined1 auVar149 [16];
  undefined1 auVar150 [16];
  undefined1 auVar151 [16];
  undefined1 auVar152 [16];
  undefined1 auVar153 [16];
  undefined1 auVar154 [16];
  undefined1 auVar155 [16];
  undefined1 auVar156 [16];
  undefined1 auVar157 [16];
  undefined1 auVar158 [16];
  undefined1 auVar159 [16];
  undefined1 auVar160 [16];
  undefined1 auVar161 [32];
  undefined1 auVar162 [32];
  float fVar163;
  float fVar179;
  float fVar180;
  vint4 bi;
  undefined1 auVar164 [16];
  undefined1 auVar165 [16];
  undefined1 auVar166 [16];
  float fVar181;
  undefined1 auVar167 [16];
  undefined1 auVar168 [16];
  undefined1 auVar169 [16];
  undefined1 auVar170 [16];
  undefined1 auVar171 [16];
  undefined1 auVar172 [16];
  undefined1 auVar173 [16];
  undefined1 auVar174 [16];
  undefined1 auVar175 [16];
  undefined1 auVar176 [16];
  undefined1 auVar177 [16];
  undefined1 auVar178 [32];
  vint4 ai_1;
  undefined1 auVar182 [16];
  undefined1 auVar183 [16];
  undefined1 auVar184 [16];
  undefined1 auVar185 [16];
  undefined1 auVar186 [16];
  undefined1 auVar187 [16];
  undefined1 auVar188 [16];
  undefined1 auVar189 [16];
  undefined1 auVar190 [16];
  undefined1 auVar191 [16];
  undefined1 auVar192 [16];
  undefined1 auVar193 [16];
  undefined1 auVar194 [16];
  undefined1 auVar195 [16];
  undefined1 auVar196 [16];
  undefined1 auVar197 [16];
  undefined1 auVar198 [16];
  undefined1 auVar199 [16];
  undefined1 auVar200 [32];
  vint4 ai_2;
  undefined1 auVar201 [16];
  undefined1 auVar202 [16];
  undefined1 auVar203 [16];
  undefined1 auVar204 [16];
  undefined1 auVar205 [16];
  undefined1 auVar206 [16];
  undefined1 auVar207 [16];
  undefined1 auVar208 [16];
  undefined1 auVar209 [16];
  undefined1 auVar210 [16];
  undefined1 auVar211 [16];
  undefined1 auVar212 [16];
  undefined1 auVar213 [16];
  undefined1 auVar214 [16];
  undefined1 auVar215 [16];
  undefined1 auVar216 [16];
  undefined1 auVar217 [32];
  float fVar219;
  float fVar220;
  float fVar235;
  float fVar237;
  undefined1 auVar221 [16];
  undefined1 auVar222 [16];
  undefined1 auVar223 [16];
  undefined1 auVar224 [16];
  undefined1 auVar225 [16];
  undefined1 auVar226 [16];
  undefined1 auVar227 [16];
  undefined1 auVar228 [16];
  undefined1 auVar229 [16];
  undefined1 auVar230 [16];
  undefined1 auVar231 [16];
  float fVar239;
  float fVar240;
  float fVar241;
  undefined1 auVar232 [32];
  undefined1 auVar233 [32];
  float fVar236;
  float fVar238;
  undefined1 auVar234 [32];
  undefined1 auVar242 [16];
  undefined1 auVar243 [16];
  undefined1 auVar244 [16];
  undefined1 auVar245 [16];
  undefined1 auVar246 [16];
  undefined1 auVar248 [16];
  undefined1 auVar249 [16];
  undefined1 auVar250 [16];
  undefined1 auVar251 [16];
  undefined1 auVar252 [16];
  undefined1 auVar247 [16];
  undefined1 auVar253 [32];
  undefined1 auVar254 [32];
  undefined1 auVar255 [16];
  undefined1 auVar256 [16];
  undefined1 auVar257 [16];
  undefined1 auVar258 [16];
  undefined1 auVar259 [16];
  undefined1 auVar260 [16];
  undefined1 auVar261 [16];
  undefined1 auVar262 [16];
  undefined1 auVar263 [16];
  undefined1 auVar264 [16];
  undefined1 auVar265 [32];
  undefined1 auVar266 [16];
  undefined1 auVar267 [16];
  undefined1 auVar268 [16];
  undefined1 auVar286 [16];
  undefined1 auVar269 [16];
  undefined1 auVar270 [16];
  undefined1 auVar271 [16];
  undefined1 auVar272 [16];
  undefined1 auVar273 [16];
  undefined1 auVar274 [16];
  undefined1 auVar275 [16];
  undefined1 auVar276 [16];
  undefined1 auVar277 [16];
  float fVar285;
  undefined1 auVar278 [16];
  undefined1 auVar279 [16];
  undefined1 auVar280 [16];
  undefined1 auVar281 [16];
  undefined1 auVar282 [16];
  undefined1 auVar283 [16];
  undefined1 auVar284 [16];
  undefined1 auVar287 [16];
  undefined1 auVar288 [16];
  undefined1 auVar289 [16];
  undefined1 auVar290 [16];
  undefined1 auVar291 [16];
  undefined1 auVar292 [32];
  undefined1 auVar293 [32];
  undefined1 auVar294 [32];
  float fVar295;
  float fVar310;
  float fVar311;
  undefined1 auVar296 [16];
  undefined1 auVar297 [16];
  undefined1 auVar298 [16];
  float fVar312;
  undefined1 auVar299 [16];
  undefined1 auVar300 [16];
  undefined1 auVar301 [16];
  undefined1 auVar302 [16];
  undefined1 auVar303 [16];
  undefined1 auVar304 [16];
  undefined1 auVar305 [16];
  undefined1 auVar306 [16];
  undefined1 auVar307 [16];
  undefined1 auVar308 [16];
  undefined1 auVar309 [32];
  undefined1 auVar313 [16];
  undefined1 auVar314 [16];
  undefined1 auVar315 [16];
  undefined1 auVar316 [16];
  undefined1 auVar318 [16];
  undefined1 auVar319 [16];
  undefined1 auVar320 [16];
  undefined1 auVar317 [16];
  undefined1 auVar321 [32];
  undefined1 auVar322 [32];
  undefined1 auVar323 [16];
  undefined1 auVar324 [16];
  undefined1 auVar325 [16];
  undefined1 auVar326 [16];
  undefined1 auVar327 [16];
  undefined1 auVar328 [16];
  undefined1 auVar329 [16];
  undefined1 auVar330 [16];
  undefined1 auVar332 [32];
  vfloat_impl<4> p01;
  vfloat_impl<4> p02;
  vfloat_impl<4> p00;
  uint mask_stack [4];
  RTCFilterFunctionNArguments args;
  vfloat_impl<4> p03;
  BBox1f cu_stack [4];
  BBox1f cv_stack [4];
  float local_770;
  float fStack_76c;
  float fStack_768;
  undefined1 local_760 [8];
  undefined8 uStack_758;
  undefined8 uStack_750;
  undefined8 uStack_748;
  undefined1 local_700 [8];
  undefined8 uStack_6f8;
  undefined8 uStack_6f0;
  undefined8 uStack_6e8;
  float local_640;
  float fStack_63c;
  float fStack_638;
  float fStack_634;
  undefined1 local_620 [8];
  undefined8 uStack_618;
  undefined8 uStack_610;
  undefined8 uStack_608;
  undefined1 local_600 [8];
  float fStack_5f8;
  float fStack_5f4;
  float fStack_5f0;
  float fStack_5ec;
  float fStack_5e8;
  float fStack_5e4;
  float local_5e0;
  float fStack_5dc;
  float fStack_5d8;
  float fStack_5d4;
  float local_5c0;
  float fStack_5bc;
  float fStack_5b8;
  float fStack_5b4;
  float local_5b0;
  float fStack_5ac;
  float fStack_5a8;
  float fStack_5a4;
  float local_560;
  float fStack_55c;
  float fStack_558;
  float fStack_554;
  float local_550;
  float fStack_54c;
  float fStack_548;
  float fStack_544;
  undefined4 local_520;
  undefined4 local_510;
  uint auStack_4e0 [4];
  RTCFilterFunctionNArguments local_4d0;
  undefined1 local_4a0 [32];
  undefined1 local_480 [8];
  float fStack_478;
  float fStack_474;
  undefined1 local_470 [16];
  undefined1 local_460 [16];
  undefined1 local_450 [16];
  undefined1 local_440 [16];
  undefined1 local_430 [16];
  undefined1 local_420 [16];
  undefined1 local_410 [16];
  undefined1 local_400 [16];
  undefined1 local_3f0 [16];
  undefined1 local_3e0 [16];
  undefined1 local_3d0 [16];
  undefined1 local_3c0 [16];
  undefined1 local_3b0 [8];
  float fStack_3a8;
  float fStack_3a4;
  undefined1 local_3a0 [16];
  undefined1 local_390 [16];
  uint uStack_380;
  float afStack_37c [7];
  undefined1 local_360 [32];
  uint local_340;
  uint uStack_33c;
  uint uStack_338;
  uint uStack_334;
  uint uStack_330;
  uint uStack_32c;
  uint uStack_328;
  uint uStack_324;
  uint local_320;
  uint uStack_31c;
  uint uStack_318;
  uint uStack_314;
  uint uStack_310;
  uint uStack_30c;
  uint uStack_308;
  uint uStack_304;
  undefined1 local_300 [32];
  undefined1 local_2e0 [32];
  float local_2c0;
  float fStack_2bc;
  float fStack_2b8;
  float fStack_2b4;
  float fStack_2b0;
  float fStack_2ac;
  float fStack_2a8;
  float fStack_2a4;
  float local_2a0;
  float fStack_29c;
  float fStack_298;
  float fStack_294;
  float fStack_290;
  float fStack_28c;
  float fStack_288;
  undefined4 uStack_284;
  undefined1 local_280 [32];
  undefined1 local_260 [32];
  undefined1 local_240 [32];
  undefined1 local_220 [32];
  undefined1 local_200 [32];
  float local_1e0;
  float fStack_1dc;
  float fStack_1d8;
  float fStack_1d4;
  float fStack_1d0;
  float fStack_1cc;
  float fStack_1c8;
  float fStack_1c4;
  float local_1c0;
  float fStack_1bc;
  float fStack_1b8;
  float fStack_1b4;
  float fStack_1b0;
  float fStack_1ac;
  float fStack_1a8;
  float fStack_1a4;
  ulong auStack_1a0 [4];
  undefined8 local_180;
  undefined8 uStack_178;
  undefined8 uStack_170;
  undefined8 uStack_168;
  undefined8 local_160;
  undefined8 uStack_158;
  undefined8 uStack_150;
  undefined8 uStack_148;
  undefined4 local_140;
  undefined4 uStack_13c;
  undefined4 uStack_138;
  undefined4 uStack_134;
  undefined4 uStack_130;
  undefined4 uStack_12c;
  undefined4 uStack_128;
  undefined4 uStack_124;
  float local_120;
  float fStack_11c;
  float fStack_118;
  float fStack_114;
  float fStack_110;
  float fStack_10c;
  float fStack_108;
  float fStack_104;
  undefined8 local_100;
  undefined8 uStack_f8;
  undefined8 uStack_f0;
  undefined8 uStack_e8;
  undefined8 local_e0;
  undefined8 uStack_d8;
  undefined8 uStack_d0;
  undefined8 uStack_c8;
  undefined1 local_c0 [32];
  uint local_a0;
  uint uStack_9c;
  uint uStack_98;
  uint uStack_94;
  uint uStack_90;
  uint uStack_8c;
  uint uStack_88;
  uint uStack_84;
  uint local_80;
  uint uStack_7c;
  uint uStack_78;
  uint uStack_74;
  uint uStack_70;
  uint uStack_6c;
  uint uStack_68;
  uint uStack_64;
  ulong uVar59;
  float fVar218;
  undefined1 auVar331 [32];
  
  PVar7 = prim[1];
  uVar58 = (ulong)(byte)PVar7;
  auVar17 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + uVar58 * 4 + 6)));
  auVar18 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + uVar58 * 5 + 6)));
  auVar19 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + uVar58 * 6 + 6)));
  auVar185 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + uVar58 * 0xf + 6)));
  lVar65 = uVar58 * 0x25;
  auVar102._1_3_ = 0;
  auVar102[0] = PVar7;
  auVar20 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + (ulong)(byte)PVar7 * 0x10 + 6)));
  auVar21 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + uVar58 * 0x11 + 6)));
  auVar22 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + uVar58 * 0x1a + 6)));
  auVar186 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + uVar58 * 0x1b + 6)));
  auVar23 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + uVar58 * 0x1c + 6)));
  auVar15 = vinsertps_avx(ZEXT416(*(uint *)(ray + k * 4)),ZEXT416(*(uint *)(ray + k * 4 + 0x20)),
                          0x10);
  auVar15 = vinsertps_avx(auVar15,ZEXT416(*(uint *)(ray + k * 4 + 0x40)),0x20);
  fVar69 = *(float *)(prim + lVar65 + 0x12);
  auVar165 = vsubps_avx(auVar15,*(undefined1 (*) [16])(prim + lVar65 + 6));
  fVar98 = (*(float *)(ray + k * 4 + 0xe0) - *(float *)(prim + lVar65 + 0x16)) *
           *(float *)(prim + lVar65 + 0x1a);
  auVar15 = vinsertps_avx(ZEXT416(*(uint *)(ray + k * 4 + 0x80)),
                          ZEXT416(*(uint *)(ray + k * 4 + 0xa0)),0x10);
  auVar15 = vinsertps_avx(auVar15,ZEXT416(*(uint *)(ray + k * 4 + 0xc0)),0x20);
  auVar242._0_4_ = fVar69 * auVar165._0_4_;
  auVar242._4_4_ = fVar69 * auVar165._4_4_;
  auVar242._8_4_ = fVar69 * auVar165._8_4_;
  auVar242._12_4_ = fVar69 * auVar165._12_4_;
  auVar323._0_4_ = fVar69 * auVar15._0_4_;
  auVar323._4_4_ = fVar69 * auVar15._4_4_;
  auVar323._8_4_ = fVar69 * auVar15._8_4_;
  auVar323._12_4_ = fVar69 * auVar15._12_4_;
  auVar15 = vcvtdq2ps_avx(auVar18);
  auVar18 = vcvtdq2ps_avx(auVar19);
  auVar19 = vcvtdq2ps_avx(auVar20);
  auVar20 = vcvtdq2ps_avx(auVar21);
  auVar21 = vcvtdq2ps_avx(auVar186);
  auVar186 = vcvtdq2ps_avx(auVar23);
  auVar23 = vshufps_avx(auVar323,auVar323,0x55);
  auVar165 = vshufps_avx(auVar323,auVar323,0xaa);
  fVar69 = auVar165._0_4_;
  auVar255._0_4_ = fVar69 * auVar18._0_4_;
  fVar95 = auVar165._4_4_;
  auVar255._4_4_ = fVar95 * auVar18._4_4_;
  fVar146 = auVar165._8_4_;
  auVar255._8_4_ = fVar146 * auVar18._8_4_;
  fVar96 = auVar165._12_4_;
  auVar255._12_4_ = fVar96 * auVar18._12_4_;
  auVar281._0_4_ = fVar69 * auVar20._0_4_;
  auVar281._4_4_ = fVar95 * auVar20._4_4_;
  auVar281._8_4_ = fVar146 * auVar20._8_4_;
  auVar281._12_4_ = fVar96 * auVar20._12_4_;
  auVar192._0_4_ = auVar186._0_4_ * fVar69;
  auVar192._4_4_ = auVar186._4_4_ * fVar95;
  auVar192._8_4_ = auVar186._8_4_ * fVar146;
  auVar192._12_4_ = auVar186._12_4_ * fVar96;
  auVar70 = vfmadd231ps_fma(auVar255,auVar23,auVar15);
  auVar100 = vfmadd231ps_fma(auVar281,auVar23,auVar19);
  auVar101 = vfmadd231ps_fma(auVar192,auVar21,auVar23);
  auVar23 = vshufps_avx(auVar242,auVar242,0xaa);
  fVar69 = auVar23._0_4_;
  auVar286._0_4_ = fVar69 * auVar18._0_4_;
  fVar95 = auVar23._4_4_;
  auVar286._4_4_ = fVar95 * auVar18._4_4_;
  fVar146 = auVar23._8_4_;
  auVar286._8_4_ = fVar146 * auVar18._8_4_;
  fVar96 = auVar23._12_4_;
  auVar286._12_4_ = fVar96 * auVar18._12_4_;
  auVar108._0_4_ = fVar69 * auVar20._0_4_;
  auVar108._4_4_ = fVar95 * auVar20._4_4_;
  auVar108._8_4_ = fVar146 * auVar20._8_4_;
  auVar108._12_4_ = fVar96 * auVar20._12_4_;
  auVar129._0_4_ = auVar186._0_4_ * fVar69;
  auVar129._4_4_ = auVar186._4_4_ * fVar95;
  auVar129._8_4_ = auVar186._8_4_ * fVar146;
  auVar129._12_4_ = auVar186._12_4_ * fVar96;
  auVar20 = vshufps_avx(auVar242,auVar242,0x55);
  auVar186 = vfmadd231ps_fma(auVar286,auVar20,auVar15);
  auVar15._8_8_ = 0;
  auVar15._0_8_ = *(ulong *)(prim + uVar58 * 7 + 6);
  auVar23 = vpmovsxwd_avx(auVar15);
  auVar130 = vfmadd231ps_fma(auVar108,auVar20,auVar19);
  auVar18._8_8_ = 0;
  auVar18._0_8_ = *(ulong *)(prim + uVar58 * 0xb + 6);
  auVar165 = vpmovsxwd_avx(auVar18);
  auVar129 = vfmadd231ps_fma(auVar129,auVar20,auVar21);
  auVar19._8_8_ = 0;
  auVar19._0_8_ = *(ulong *)(prim + uVar58 * 9 + 6);
  auVar187 = vpmovsxwd_avx(auVar19);
  auVar20._8_8_ = 0;
  auVar20._0_8_ = *(ulong *)(prim + uVar58 * 0xd + 6);
  auVar71 = vpmovsxwd_avx(auVar20);
  auVar15 = vcvtdq2ps_avx(auVar17);
  auVar18 = vcvtdq2ps_avx(auVar185);
  auVar19 = vcvtdq2ps_avx(auVar22);
  auVar324._4_4_ = auVar323._0_4_;
  auVar324._0_4_ = auVar323._0_4_;
  auVar324._8_4_ = auVar323._0_4_;
  auVar324._12_4_ = auVar323._0_4_;
  auVar20 = vfmadd231ps_fma(auVar70,auVar324,auVar15);
  auVar17 = vfmadd231ps_fma(auVar100,auVar324,auVar18);
  auVar22 = vfmadd231ps_fma(auVar101,auVar19,auVar324);
  auVar243._4_4_ = auVar242._0_4_;
  auVar243._0_4_ = auVar242._0_4_;
  auVar243._8_4_ = auVar242._0_4_;
  auVar243._12_4_ = auVar242._0_4_;
  auVar101 = vfmadd231ps_fma(auVar186,auVar243,auVar15);
  auVar21._8_8_ = 0;
  auVar21._0_8_ = *(ulong *)(prim + uVar58 * 0x12 + 6);
  auVar185 = vpmovsxwd_avx(auVar21);
  auVar130 = vfmadd231ps_fma(auVar130,auVar243,auVar18);
  auVar129 = vfmadd231ps_fma(auVar129,auVar243,auVar19);
  auVar313._8_4_ = 0x7fffffff;
  auVar313._0_8_ = 0x7fffffff7fffffff;
  auVar313._12_4_ = 0x7fffffff;
  auVar15 = vandps_avx(auVar20,auVar313);
  auVar100._8_4_ = 0x219392ef;
  auVar100._0_8_ = 0x219392ef219392ef;
  auVar100._12_4_ = 0x219392ef;
  auVar15 = vcmpps_avx(auVar15,auVar100,1);
  auVar18 = vblendvps_avx(auVar20,auVar100,auVar15);
  auVar15 = vandps_avx(auVar313,auVar17);
  auVar15 = vcmpps_avx(auVar15,auVar100,1);
  auVar19 = vblendvps_avx(auVar17,auVar100,auVar15);
  auVar15 = vandps_avx(auVar313,auVar22);
  auVar15 = vcmpps_avx(auVar15,auVar100,1);
  auVar15 = vblendvps_avx(auVar22,auVar100,auVar15);
  auVar186._8_8_ = 0;
  auVar186._0_8_ = *(ulong *)(prim + uVar58 * 0x16 + 6);
  auVar186 = vpmovsxwd_avx(auVar186);
  auVar17._8_8_ = 0;
  auVar17._0_8_ = *(ulong *)(prim + uVar58 * 0x14 + 6);
  auVar17 = vpmovsxwd_avx(auVar17);
  auVar314._4_4_ = fVar98;
  auVar314._0_4_ = fVar98;
  auVar314._8_4_ = fVar98;
  auVar314._12_4_ = fVar98;
  auVar20 = vcvtdq2ps_avx(auVar23);
  auVar21 = vcvtdq2ps_avx(auVar165);
  auVar21 = vsubps_avx(auVar21,auVar20);
  auVar70 = vfmadd213ps_fma(auVar21,auVar314,auVar20);
  auVar20 = vcvtdq2ps_avx(auVar187);
  auVar21 = vcvtdq2ps_avx(auVar71);
  auVar21 = vsubps_avx(auVar21,auVar20);
  auVar71 = vfmadd213ps_fma(auVar21,auVar314,auVar20);
  auVar20 = vcvtdq2ps_avx(auVar185);
  auVar21 = vcvtdq2ps_avx(auVar186);
  auVar21 = vsubps_avx(auVar21,auVar20);
  auVar100 = vfmadd213ps_fma(auVar21,auVar314,auVar20);
  auVar20 = vcvtdq2ps_avx(auVar17);
  auVar185._8_8_ = 0;
  auVar185._0_8_ = *(ulong *)(prim + uVar58 * 0x18 + 6);
  auVar21 = vpmovsxwd_avx(auVar185);
  auVar21 = vcvtdq2ps_avx(auVar21);
  auVar186 = vsubps_avx(auVar21,auVar20);
  auVar22._8_8_ = 0;
  auVar22._0_8_ = *(ulong *)(prim + uVar58 * 0x1d + 6);
  auVar21 = vpmovsxwd_avx(auVar22);
  auVar17 = vfmadd213ps_fma(auVar186,auVar314,auVar20);
  auVar20 = vcvtdq2ps_avx(auVar21);
  auVar23._8_8_ = 0;
  auVar23._0_8_ = *(ulong *)(prim + uVar58 * 0x21 + 6);
  auVar21 = vpmovsxwd_avx(auVar23);
  auVar21 = vcvtdq2ps_avx(auVar21);
  auVar186 = vsubps_avx(auVar21,auVar20);
  auVar165._8_8_ = 0;
  auVar165._0_8_ = *(ulong *)(prim + uVar58 * 0x1f + 6);
  auVar21 = vpmovsxwd_avx(auVar165);
  auVar186 = vfmadd213ps_fma(auVar186,auVar314,auVar20);
  auVar20 = vcvtdq2ps_avx(auVar21);
  auVar187._8_8_ = 0;
  auVar187._0_8_ = *(ulong *)(prim + uVar58 * 0x23 + 6);
  auVar21 = vpmovsxwd_avx(auVar187);
  auVar21 = vcvtdq2ps_avx(auVar21);
  auVar21 = vsubps_avx(auVar21,auVar20);
  auVar21 = vfmadd213ps_fma(auVar21,auVar314,auVar20);
  auVar20 = vrcpps_avx(auVar18);
  auVar296._8_4_ = 0x3f800000;
  auVar296._0_8_ = 0x3f8000003f800000;
  auVar296._12_4_ = 0x3f800000;
  auVar18 = vfnmadd213ps_fma(auVar18,auVar20,auVar296);
  auVar20 = vfmadd132ps_fma(auVar18,auVar20,auVar20);
  auVar18 = vrcpps_avx(auVar19);
  auVar19 = vfnmadd213ps_fma(auVar19,auVar18,auVar296);
  auVar19 = vfmadd132ps_fma(auVar19,auVar18,auVar18);
  auVar18 = vrcpps_avx(auVar15);
  auVar15 = vfnmadd213ps_fma(auVar15,auVar18,auVar296);
  auVar18 = vfmadd132ps_fma(auVar15,auVar18,auVar18);
  auVar15 = vsubps_avx(auVar70,auVar101);
  auVar70._0_4_ = auVar20._0_4_ * auVar15._0_4_;
  auVar70._4_4_ = auVar20._4_4_ * auVar15._4_4_;
  auVar70._8_4_ = auVar20._8_4_ * auVar15._8_4_;
  auVar70._12_4_ = auVar20._12_4_ * auVar15._12_4_;
  auVar15 = vsubps_avx(auVar71,auVar101);
  auVar164._0_4_ = auVar20._0_4_ * auVar15._0_4_;
  auVar164._4_4_ = auVar20._4_4_ * auVar15._4_4_;
  auVar164._8_4_ = auVar20._8_4_ * auVar15._8_4_;
  auVar164._12_4_ = auVar20._12_4_ * auVar15._12_4_;
  auVar15 = vsubps_avx(auVar100,auVar130);
  auVar182._0_4_ = auVar19._0_4_ * auVar15._0_4_;
  auVar182._4_4_ = auVar19._4_4_ * auVar15._4_4_;
  auVar182._8_4_ = auVar19._8_4_ * auVar15._8_4_;
  auVar182._12_4_ = auVar19._12_4_ * auVar15._12_4_;
  auVar15 = vsubps_avx(auVar17,auVar130);
  auVar147._0_4_ = auVar19._0_4_ * auVar15._0_4_;
  auVar147._4_4_ = auVar19._4_4_ * auVar15._4_4_;
  auVar147._8_4_ = auVar19._8_4_ * auVar15._8_4_;
  auVar147._12_4_ = auVar19._12_4_ * auVar15._12_4_;
  auVar15 = vsubps_avx(auVar186,auVar129);
  auVar201._0_4_ = auVar18._0_4_ * auVar15._0_4_;
  auVar201._4_4_ = auVar18._4_4_ * auVar15._4_4_;
  auVar201._8_4_ = auVar18._8_4_ * auVar15._8_4_;
  auVar201._12_4_ = auVar18._12_4_ * auVar15._12_4_;
  auVar15 = vsubps_avx(auVar21,auVar129);
  auVar101._0_4_ = auVar18._0_4_ * auVar15._0_4_;
  auVar101._4_4_ = auVar18._4_4_ * auVar15._4_4_;
  auVar101._8_4_ = auVar18._8_4_ * auVar15._8_4_;
  auVar101._12_4_ = auVar18._12_4_ * auVar15._12_4_;
  auVar15 = vpminsd_avx(auVar70,auVar164);
  auVar18 = vpminsd_avx(auVar182,auVar147);
  auVar15 = vmaxps_avx(auVar15,auVar18);
  auVar18 = vpminsd_avx(auVar201,auVar101);
  uVar67 = *(undefined4 *)(ray + k * 4 + 0x60);
  auVar154._4_4_ = uVar67;
  auVar154._0_4_ = uVar67;
  auVar154._8_4_ = uVar67;
  auVar154._12_4_ = uVar67;
  auVar18 = vmaxps_avx(auVar18,auVar154);
  auVar15 = vmaxps_avx(auVar15,auVar18);
  local_440._0_4_ = auVar15._0_4_ * 0.99999964;
  local_440._4_4_ = auVar15._4_4_ * 0.99999964;
  local_440._8_4_ = auVar15._8_4_ * 0.99999964;
  local_440._12_4_ = auVar15._12_4_ * 0.99999964;
  auVar15 = vpmaxsd_avx(auVar70,auVar164);
  auVar18 = vpmaxsd_avx(auVar182,auVar147);
  auVar15 = vminps_avx(auVar15,auVar18);
  auVar18 = vpmaxsd_avx(auVar201,auVar101);
  uVar67 = *(undefined4 *)(ray + k * 4 + 0x100);
  auVar130._4_4_ = uVar67;
  auVar130._0_4_ = uVar67;
  auVar130._8_4_ = uVar67;
  auVar130._12_4_ = uVar67;
  auVar18 = vminps_avx(auVar18,auVar130);
  auVar15 = vminps_avx(auVar15,auVar18);
  auVar71._0_4_ = auVar15._0_4_ * 1.0000004;
  auVar71._4_4_ = auVar15._4_4_ * 1.0000004;
  auVar71._8_4_ = auVar15._8_4_ * 1.0000004;
  auVar71._12_4_ = auVar15._12_4_ * 1.0000004;
  auVar102[4] = PVar7;
  auVar102._5_3_ = 0;
  auVar102[8] = PVar7;
  auVar102._9_3_ = 0;
  auVar102[0xc] = PVar7;
  auVar102._13_3_ = 0;
  auVar18 = vpcmpgtd_avx(auVar102,_DAT_01f4ad30);
  auVar15 = vcmpps_avx(local_440,auVar71,2);
  auVar15 = vandps_avx(auVar15,auVar18);
  uVar67 = vmovmskps_avx(auVar15);
  uVar58 = CONCAT44((int)((ulong)prim >> 0x20),uVar67);
  auVar91._16_16_ = mm_lookupmask_ps._240_16_;
  auVar91._0_16_ = mm_lookupmask_ps._240_16_;
  local_300 = vblendps_avx(auVar91,ZEXT832(0) << 0x20,0x80);
  iVar55 = 1 << ((uint)k & 0x1f);
  auVar92._4_4_ = iVar55;
  auVar92._0_4_ = iVar55;
  auVar92._8_4_ = iVar55;
  auVar92._12_4_ = iVar55;
  auVar92._16_4_ = iVar55;
  auVar92._20_4_ = iVar55;
  auVar92._24_4_ = iVar55;
  auVar92._28_4_ = iVar55;
  auVar25 = vpmovzxbd_avx2(ZEXT816(0x8040201008040201));
  auVar91 = vpand_avx2(auVar92,auVar25);
  local_360 = vpcmpeqd_avx2(auVar91,auVar25);
LAB_01240cad:
  if (uVar58 == 0) {
LAB_01242e1f:
    return uVar58 != 0;
  }
  lVar65 = 0;
  for (uVar62 = uVar58; (uVar62 & 1) == 0; uVar62 = uVar62 >> 1 | 0x8000000000000000) {
    lVar65 = lVar65 + 1;
  }
  uVar57 = *(uint *)(prim + 2);
  pGVar8 = (context->scene->geometries).items[uVar57].ptr;
  fVar69 = (pGVar8->time_range).lower;
  fVar95 = pGVar8->fnumTimeSegments *
           ((*(float *)(ray + k * 4 + 0xe0) - fVar69) / ((pGVar8->time_range).upper - fVar69));
  auVar15 = vroundss_avx(ZEXT416((uint)fVar95),ZEXT416((uint)fVar95),9);
  auVar15 = vminss_avx(auVar15,ZEXT416((uint)(pGVar8->fnumTimeSegments + -1.0)));
  auVar23 = vmaxss_avx(ZEXT816(0),auVar15);
  local_340 = *(uint *)(prim + lVar65 * 4 + 6);
  uVar62 = (ulong)*(uint *)(*(long *)&pGVar8->field_0x58 +
                           (ulong)local_340 *
                           pGVar8[1].super_RefCount.refCounter.super___atomic_base<unsigned_long>.
                           _M_i);
  _Var9 = pGVar8[4].super_RefCount.refCounter.super___atomic_base<unsigned_long>._M_i;
  lVar66 = (long)(int)auVar23._0_4_ * 0x38;
  lVar10 = *(long *)(_Var9 + lVar66);
  lVar11 = *(long *)(_Var9 + 0x10 + lVar66);
  auVar15 = *(undefined1 (*) [16])(lVar10 + lVar11 * uVar62);
  lVar65 = uVar62 + 1;
  auVar18 = *(undefined1 (*) [16])(lVar10 + lVar11 * lVar65);
  lVar1 = uVar62 + 2;
  auVar19 = *(undefined1 (*) [16])(lVar10 + lVar11 * lVar1);
  lVar2 = uVar62 + 3;
  pauVar3 = (undefined1 (*) [16])(lVar10 + lVar11 * lVar2);
  auVar201 = *pauVar3;
  lVar10 = *(long *)&pGVar8[4].fnumTimeSegments;
  lVar11 = *(long *)(lVar10 + lVar66);
  lVar12 = *(long *)(lVar10 + 0x10 + lVar66);
  auVar20 = *(undefined1 (*) [16])(lVar11 + lVar12 * uVar62);
  auVar21 = *(undefined1 (*) [16])(lVar11 + lVar12 * lVar65);
  auVar186 = *(undefined1 (*) [16])(lVar11 + lVar12 * lVar1);
  pfVar4 = (float *)(lVar11 + lVar12 * lVar2);
  fVar69 = *pfVar4;
  fVar98 = pfVar4[1];
  fVar146 = pfVar4[2];
  fVar96 = pfVar4[3];
  auVar277._0_4_ = *(float *)*pauVar3 * 0.0;
  auVar277._4_4_ = *(float *)(*pauVar3 + 4) * 0.0;
  auVar277._8_4_ = *(float *)(*pauVar3 + 8) * 0.0;
  auVar277._12_4_ = *(float *)(*pauVar3 + 0xc) * 0.0;
  auVar297._8_4_ = 0x3e2aaaab;
  auVar297._0_8_ = 0x3e2aaaab3e2aaaab;
  auVar297._12_4_ = 0x3e2aaaab;
  auVar71 = vfmadd213ps_fma(auVar297,auVar19,auVar277);
  auVar325._8_4_ = 0x3f000000;
  auVar325._0_8_ = 0x3f0000003f000000;
  auVar325._12_4_ = 0x3f000000;
  auVar17 = vfmadd231ps_fma(auVar277,auVar19,auVar325);
  auVar165 = ZEXT816(0) << 0x20;
  auVar17 = vfnmadd231ps_fma(auVar17,auVar18,auVar165);
  auVar286 = vfnmadd231ps_fma(auVar17,auVar15,auVar325);
  auVar183._0_4_ = fVar69 * 0.0;
  auVar183._4_4_ = fVar98 * 0.0;
  auVar183._8_4_ = fVar146 * 0.0;
  auVar183._12_4_ = fVar96 * 0.0;
  auVar17 = vfmadd213ps_fma(auVar297,auVar186,auVar183);
  auVar148._8_4_ = 0x3f2aaaab;
  auVar148._0_8_ = 0x3f2aaaab3f2aaaab;
  auVar148._12_4_ = 0x3f2aaaab;
  auVar17 = vfmadd231ps_fma(auVar17,auVar21,auVar148);
  auVar17 = vfmadd231ps_fma(auVar17,auVar20,auVar297);
  auVar185 = vfmadd231ps_fma(auVar183,auVar186,auVar325);
  auVar185 = vfnmadd231ps_fma(auVar185,auVar21,auVar165);
  auVar22 = vfnmadd231ps_fma(auVar185,auVar20,auVar325);
  auVar298._0_4_ = *(float *)*pauVar3 * 0.5;
  auVar298._4_4_ = *(float *)(*pauVar3 + 4) * 0.5;
  auVar298._8_4_ = *(float *)(*pauVar3 + 8) * 0.5;
  auVar298._12_4_ = *(float *)(*pauVar3 + 0xc) * 0.5;
  auVar185 = vfmadd231ps_fma(auVar298,auVar165,auVar19);
  auVar185 = vfnmadd231ps_fma(auVar185,auVar325,auVar18);
  auVar164 = vfnmadd231ps_fma(auVar185,auVar165,auVar15);
  auVar244._0_4_ = fVar69 * 0.16666667;
  auVar244._4_4_ = fVar98 * 0.16666667;
  auVar244._8_4_ = fVar146 * 0.16666667;
  auVar244._12_4_ = fVar96 * 0.16666667;
  auVar185 = vfmadd231ps_fma(auVar244,auVar186,auVar148);
  auVar185 = vfmadd231ps_fma(auVar185,auVar21,auVar297);
  auVar185 = vfmadd231ps_fma(auVar185,auVar20,auVar165);
  auVar202._0_4_ = fVar69 * 0.5;
  auVar202._4_4_ = fVar98 * 0.5;
  auVar202._8_4_ = fVar146 * 0.5;
  auVar202._12_4_ = fVar96 * 0.5;
  auVar186 = vfmadd231ps_fma(auVar202,auVar165,auVar186);
  auVar21 = vfnmadd231ps_fma(auVar186,auVar325,auVar21);
  auVar186 = vfnmadd231ps_fma(auVar21,auVar165,auVar20);
  auVar20 = vshufps_avx(auVar286,auVar286,0xc9);
  auVar21 = vshufps_avx(auVar17,auVar17,0xc9);
  fVar240 = auVar286._0_4_;
  auVar103._0_4_ = fVar240 * auVar21._0_4_;
  fVar241 = auVar286._4_4_;
  auVar103._4_4_ = fVar241 * auVar21._4_4_;
  fVar97 = auVar286._8_4_;
  auVar103._8_4_ = fVar97 * auVar21._8_4_;
  fVar285 = auVar286._12_4_;
  auVar103._12_4_ = fVar285 * auVar21._12_4_;
  auVar100 = vfmsub231ps_fma(auVar103,auVar20,auVar17);
  auVar21 = vshufps_avx(auVar22,auVar22,0xc9);
  auVar104._0_4_ = fVar240 * auVar21._0_4_;
  auVar104._4_4_ = fVar241 * auVar21._4_4_;
  auVar104._8_4_ = fVar97 * auVar21._8_4_;
  auVar104._12_4_ = fVar285 * auVar21._12_4_;
  auVar101 = vfmsub231ps_fma(auVar104,auVar20,auVar22);
  auVar20 = vshufps_avx(auVar164,auVar164,0xc9);
  auVar21 = vshufps_avx(auVar185,auVar185,0xc9);
  fVar295 = auVar164._0_4_;
  auVar105._0_4_ = fVar295 * auVar21._0_4_;
  fVar310 = auVar164._4_4_;
  auVar105._4_4_ = fVar310 * auVar21._4_4_;
  fVar311 = auVar164._8_4_;
  auVar105._8_4_ = fVar311 * auVar21._8_4_;
  fVar312 = auVar164._12_4_;
  auVar105._12_4_ = fVar312 * auVar21._12_4_;
  auVar130 = vfmsub231ps_fma(auVar105,auVar20,auVar185);
  auVar21 = vshufps_avx(auVar186,auVar186,0xc9);
  auVar106._0_4_ = fVar295 * auVar21._0_4_;
  auVar106._4_4_ = fVar310 * auVar21._4_4_;
  auVar106._8_4_ = fVar311 * auVar21._8_4_;
  auVar106._12_4_ = fVar312 * auVar21._12_4_;
  auVar129 = vfmsub231ps_fma(auVar106,auVar20,auVar186);
  lVar11 = *(long *)(_Var9 + 0x38 + lVar66);
  lVar12 = *(long *)(_Var9 + 0x48 + lVar66);
  auVar20 = *(undefined1 (*) [16])(lVar11 + lVar12 * lVar1);
  pauVar5 = (undefined1 (*) [12])(lVar11 + lVar12 * lVar2);
  auVar54 = *pauVar5;
  fVar145 = *(float *)pauVar5[1];
  lVar13 = *(long *)(lVar10 + 0x38 + lVar66);
  lVar10 = *(long *)(lVar10 + 0x48 + lVar66);
  auVar256._0_4_ = *(float *)*pauVar5 * 0.0;
  auVar256._4_4_ = *(float *)(*pauVar5 + 4) * 0.0;
  auVar256._8_4_ = *(float *)(*pauVar5 + 8) * 0.0;
  auVar256._12_4_ = fVar145 * 0.0;
  auVar70 = vfmadd213ps_fma(auVar297,auVar20,auVar256);
  auVar186 = vfmadd231ps_fma(auVar256,auVar20,auVar325);
  auVar21 = *(undefined1 (*) [16])(lVar11 + lVar12 * lVar65);
  auVar17 = vfnmadd231ps_fma(auVar186,auVar21,ZEXT816(0) << 0x20);
  auVar186 = *(undefined1 (*) [16])(lVar11 + lVar12 * uVar62);
  auVar182 = vfnmadd231ps_fma(auVar17,auVar186,auVar325);
  auVar17 = *(undefined1 (*) [16])(lVar13 + lVar1 * lVar10);
  pfVar4 = (float *)(lVar13 + lVar10 * lVar2);
  fVar69 = *pfVar4;
  fVar98 = pfVar4[1];
  fVar146 = pfVar4[2];
  fVar96 = pfVar4[3];
  auVar72._0_4_ = fVar69 * 0.0;
  auVar72._4_4_ = fVar98 * 0.0;
  auVar72._8_4_ = fVar146 * 0.0;
  auVar72._12_4_ = fVar96 * 0.0;
  auVar22 = vfmadd213ps_fma(auVar297,auVar17,auVar72);
  auVar185 = *(undefined1 (*) [16])(lVar13 + lVar65 * lVar10);
  auVar107._8_4_ = 0x3f2aaaab;
  auVar107._0_8_ = 0x3f2aaaab3f2aaaab;
  auVar107._12_4_ = 0x3f2aaaab;
  auVar165 = vfmadd231ps_fma(auVar22,auVar185,auVar107);
  auVar22 = *(undefined1 (*) [16])(lVar13 + uVar62 * lVar10);
  auVar187 = vfmadd231ps_fma(auVar165,auVar22,auVar297);
  auVar165 = vshufps_avx(auVar187,auVar187,0xc9);
  fVar236 = auVar182._0_4_;
  auVar221._0_4_ = fVar236 * auVar165._0_4_;
  fVar237 = auVar182._4_4_;
  auVar221._4_4_ = fVar237 * auVar165._4_4_;
  fVar238 = auVar182._8_4_;
  auVar221._8_4_ = fVar238 * auVar165._8_4_;
  fVar239 = auVar182._12_4_;
  auVar221._12_4_ = fVar239 * auVar165._12_4_;
  auVar165 = vshufps_avx(auVar182,auVar182,0xc9);
  auVar102 = vfmsub231ps_fma(auVar221,auVar165,auVar187);
  auVar187 = vfmadd231ps_fma(auVar72,auVar17,auVar325);
  auVar187 = vfnmadd231ps_fma(auVar187,auVar185,_DAT_01f45a50);
  auVar108 = vfnmadd231ps_fma(auVar187,auVar22,auVar325);
  auVar187 = vshufps_avx(auVar108,auVar108,0xc9);
  auVar184._0_4_ = fVar236 * auVar187._0_4_;
  auVar184._4_4_ = fVar237 * auVar187._4_4_;
  auVar184._8_4_ = fVar238 * auVar187._8_4_;
  auVar184._12_4_ = fVar239 * auVar187._12_4_;
  auVar187 = vfmsub231ps_fma(auVar184,auVar165,auVar108);
  auVar73._0_4_ = fVar69 * 0.16666667;
  auVar73._4_4_ = fVar98 * 0.16666667;
  auVar73._8_4_ = fVar146 * 0.16666667;
  auVar73._12_4_ = fVar96 * 0.16666667;
  auVar222._8_4_ = 0x3f2aaaab;
  auVar222._0_8_ = 0x3f2aaaab3f2aaaab;
  auVar222._12_4_ = 0x3f2aaaab;
  auVar165 = vfmadd231ps_fma(auVar73,auVar17,auVar222);
  auVar149._0_4_ = fVar69 * 0.5;
  auVar149._4_4_ = fVar98 * 0.5;
  auVar149._8_4_ = fVar146 * 0.5;
  auVar149._12_4_ = fVar96 * 0.5;
  auVar108 = ZEXT816(0) << 0x20;
  auVar17 = vfmadd231ps_fma(auVar149,auVar108,auVar17);
  auVar165 = vfmadd231ps_fma(auVar165,auVar185,auVar297);
  auVar17 = vfnmadd231ps_fma(auVar17,auVar325,auVar185);
  auVar185 = vfmadd231ps_fma(auVar165,auVar22,auVar108);
  auVar22 = vfnmadd231ps_fma(auVar17,auVar108,auVar22);
  local_770 = auVar54._0_4_;
  fStack_76c = auVar54._4_4_;
  fStack_768 = auVar54._8_4_;
  auVar245._0_4_ = local_770 * 0.5;
  auVar245._4_4_ = fStack_76c * 0.5;
  auVar245._8_4_ = fStack_768 * 0.5;
  auVar245._12_4_ = fVar145 * 0.5;
  auVar17 = vfmadd231ps_fma(auVar245,auVar108,auVar20);
  auVar17 = vfnmadd231ps_fma(auVar17,auVar325,auVar21);
  auVar192 = vfnmadd231ps_fma(auVar17,auVar108,auVar186);
  auVar17 = vshufps_avx(auVar185,auVar185,0xc9);
  fVar220 = auVar192._0_4_;
  auVar109._0_4_ = fVar220 * auVar17._0_4_;
  fVar218 = auVar192._4_4_;
  auVar109._4_4_ = fVar218 * auVar17._4_4_;
  fVar219 = auVar192._8_4_;
  auVar109._8_4_ = fVar219 * auVar17._8_4_;
  fVar235 = auVar192._12_4_;
  auVar109._12_4_ = fVar235 * auVar17._12_4_;
  auVar17 = vshufps_avx(auVar192,auVar192,0xc9);
  auVar108 = vfmsub231ps_fma(auVar109,auVar17,auVar185);
  auVar185 = vshufps_avx(auVar22,auVar22,0xc9);
  auVar74._0_4_ = fVar220 * auVar185._0_4_;
  auVar74._4_4_ = fVar218 * auVar185._4_4_;
  auVar74._8_4_ = fVar219 * auVar185._8_4_;
  auVar74._12_4_ = fVar235 * auVar185._12_4_;
  auVar147 = vfmsub231ps_fma(auVar74,auVar17,auVar22);
  fVar95 = fVar95 - auVar23._0_4_;
  local_700._0_4_ = auVar201._0_4_;
  local_700._4_4_ = auVar201._4_4_;
  uStack_6f8._0_4_ = auVar201._8_4_;
  uStack_6f8._4_4_ = auVar201._12_4_;
  auVar110._0_4_ = (float)local_700._0_4_ * 0.16666667;
  auVar110._4_4_ = (float)local_700._4_4_ * 0.16666667;
  auVar110._8_4_ = (float)uStack_6f8 * 0.16666667;
  auVar110._12_4_ = uStack_6f8._4_4_ * 0.16666667;
  auVar19 = vfmadd231ps_fma(auVar110,auVar222,auVar19);
  auVar17 = vfmadd231ps_fma(auVar71,auVar18,auVar222);
  auVar185 = vfmadd231ps_fma(auVar19,auVar18,auVar297);
  auVar19 = vpermilps_avx(auVar100,0xc9);
  auVar18 = vdpps_avx(auVar19,auVar19,0x7f);
  auVar22 = vfmadd231ps_fma(auVar17,auVar15,auVar297);
  auVar23 = vfmadd231ps_fma(auVar185,auVar15,ZEXT816(0));
  auVar17 = vpermilps_avx(auVar101,0xc9);
  fVar98 = auVar18._0_4_;
  auVar185 = ZEXT416((uint)fVar98);
  auVar15 = vrsqrtss_avx(auVar185,auVar185);
  fVar69 = auVar15._0_4_;
  auVar15 = vdpps_avx(auVar19,auVar17,0x7f);
  fVar69 = fVar69 * 1.5 + fVar98 * -0.5 * fVar69 * fVar69 * fVar69;
  auVar166._0_4_ = fVar98 * auVar17._0_4_;
  auVar166._4_4_ = fVar98 * auVar17._4_4_;
  auVar166._8_4_ = fVar98 * auVar17._8_4_;
  auVar166._12_4_ = fVar98 * auVar17._12_4_;
  fVar98 = auVar15._0_4_;
  auVar203._0_4_ = fVar98 * auVar19._0_4_;
  auVar203._4_4_ = fVar98 * auVar19._4_4_;
  auVar203._8_4_ = fVar98 * auVar19._8_4_;
  auVar203._12_4_ = fVar98 * auVar19._12_4_;
  auVar17 = vsubps_avx(auVar166,auVar203);
  auVar15 = vrcpss_avx(auVar185,auVar185);
  auVar18 = vfnmadd213ss_fma(auVar18,auVar15,SUB6416(ZEXT464(0x40000000),0));
  fVar146 = auVar15._0_4_ * auVar18._0_4_;
  auVar185 = vpermilps_avx(auVar130,0xc9);
  fVar128 = auVar19._0_4_ * fVar69;
  fVar142 = auVar19._4_4_ * fVar69;
  fVar143 = auVar19._8_4_ * fVar69;
  fVar144 = auVar19._12_4_ * fVar69;
  auVar18 = vdpps_avx(auVar185,auVar185,0x7f);
  auVar15 = vblendps_avx(auVar18,_DAT_01f45a50,0xe);
  auVar19 = vrsqrtss_avx(auVar15,auVar15);
  fVar96 = auVar18._0_4_;
  fVar98 = auVar19._0_4_;
  fVar98 = fVar98 * 1.5 + fVar98 * fVar98 * fVar96 * -0.5 * fVar98;
  auVar19 = vpermilps_avx(auVar129,0xc9);
  auVar326._0_4_ = fVar96 * auVar19._0_4_;
  auVar326._4_4_ = fVar96 * auVar19._4_4_;
  auVar326._8_4_ = fVar96 * auVar19._8_4_;
  auVar326._12_4_ = fVar96 * auVar19._12_4_;
  auVar19 = vdpps_avx(auVar185,auVar19,0x7f);
  fVar96 = auVar19._0_4_;
  auVar223._0_4_ = fVar96 * auVar185._0_4_;
  auVar223._4_4_ = fVar96 * auVar185._4_4_;
  auVar223._8_4_ = fVar96 * auVar185._8_4_;
  auVar223._12_4_ = fVar96 * auVar185._12_4_;
  auVar19 = vsubps_avx(auVar326,auVar223);
  auVar15 = vrcpss_avx(auVar15,auVar15);
  auVar18 = vfnmadd213ss_fma(auVar18,auVar15,ZEXT416(0x40000000));
  fVar96 = auVar15._0_4_ * auVar18._0_4_;
  fVar163 = auVar185._0_4_ * fVar98;
  fVar179 = auVar185._4_4_ * fVar98;
  fVar180 = auVar185._8_4_ * fVar98;
  fVar181 = auVar185._12_4_ * fVar98;
  auVar15 = vshufps_avx(auVar286,auVar286,0xff);
  auVar18 = vshufps_avx(auVar22,auVar22,0xff);
  auVar224._0_4_ = auVar18._0_4_ * fVar128;
  auVar224._4_4_ = auVar18._4_4_ * fVar142;
  auVar224._8_4_ = auVar18._8_4_ * fVar143;
  auVar224._12_4_ = auVar18._12_4_ * fVar144;
  auVar75._0_4_ = auVar15._0_4_ * fVar128 + auVar18._0_4_ * fVar69 * fVar146 * auVar17._0_4_;
  auVar75._4_4_ = auVar15._4_4_ * fVar142 + auVar18._4_4_ * fVar69 * fVar146 * auVar17._4_4_;
  auVar75._8_4_ = auVar15._8_4_ * fVar143 + auVar18._8_4_ * fVar69 * fVar146 * auVar17._8_4_;
  auVar75._12_4_ = auVar15._12_4_ * fVar144 + auVar18._12_4_ * fVar69 * fVar146 * auVar17._12_4_;
  auVar17 = vsubps_avx(auVar22,auVar224);
  local_760._0_4_ = auVar22._0_4_ + auVar224._0_4_;
  local_760._4_4_ = auVar22._4_4_ + auVar224._4_4_;
  uStack_758._0_4_ = auVar22._8_4_ + auVar224._8_4_;
  uStack_758._4_4_ = auVar22._12_4_ + auVar224._12_4_;
  auVar185 = vsubps_avx(auVar286,auVar75);
  auVar15 = vshufps_avx(auVar164,auVar164,0xff);
  auVar18 = vshufps_avx(auVar23,auVar23,0xff);
  auVar167._0_4_ = auVar18._0_4_ * fVar163;
  auVar167._4_4_ = auVar18._4_4_ * fVar179;
  auVar167._8_4_ = auVar18._8_4_ * fVar180;
  auVar167._12_4_ = auVar18._12_4_ * fVar181;
  auVar150._0_4_ = auVar15._0_4_ * fVar163 + auVar18._0_4_ * fVar98 * auVar19._0_4_ * fVar96;
  auVar150._4_4_ = auVar15._4_4_ * fVar179 + auVar18._4_4_ * fVar98 * auVar19._4_4_ * fVar96;
  auVar150._8_4_ = auVar15._8_4_ * fVar180 + auVar18._8_4_ * fVar98 * auVar19._8_4_ * fVar96;
  auVar150._12_4_ = auVar15._12_4_ * fVar181 + auVar18._12_4_ * fVar98 * auVar19._12_4_ * fVar96;
  auVar19 = vsubps_avx(auVar23,auVar167);
  local_700._4_4_ = auVar23._4_4_ + auVar167._4_4_;
  local_700._0_4_ = auVar23._0_4_ + auVar167._0_4_;
  uStack_6f8._0_4_ = auVar23._8_4_ + auVar167._8_4_;
  uStack_6f8._4_4_ = auVar23._12_4_ + auVar167._12_4_;
  auVar22 = vsubps_avx(auVar164,auVar150);
  auVar76._8_4_ = 0x3e2aaaab;
  auVar76._0_8_ = 0x3e2aaaab3e2aaaab;
  auVar76._12_4_ = 0x3e2aaaab;
  auVar299._0_4_ = local_770 * 0.16666667;
  auVar299._4_4_ = fStack_76c * 0.16666667;
  auVar299._8_4_ = fStack_768 * 0.16666667;
  auVar299._12_4_ = fVar145 * 0.16666667;
  auVar131._8_4_ = 0x3f2aaaab;
  auVar131._0_8_ = 0x3f2aaaab3f2aaaab;
  auVar131._12_4_ = 0x3f2aaaab;
  auVar15 = vfmadd231ps_fma(auVar299,auVar131,auVar20);
  auVar18 = vfmadd231ps_fma(auVar70,auVar21,auVar131);
  auVar20 = vfmadd231ps_fma(auVar15,auVar21,auVar76);
  auVar21 = vpermilps_avx(auVar102,0xc9);
  auVar15 = vdpps_avx(auVar21,auVar21,0x7f);
  auVar23 = vfmadd231ps_fma(auVar18,auVar186,auVar76);
  auVar268._12_4_ = 0;
  auVar268._0_12_ = ZEXT812(0);
  auVar165 = vfmadd231ps_fma(auVar20,auVar186,auVar268 << 0x20);
  auVar20 = vpermilps_avx(auVar187,0xc9);
  fVar98 = auVar15._0_4_;
  auVar186 = ZEXT416((uint)fVar98);
  auVar18 = vrsqrtss_avx(auVar186,auVar186);
  fVar69 = auVar18._0_4_;
  auVar18 = vdpps_avx(auVar21,auVar20,0x7f);
  fVar69 = fVar69 * 1.5 + fVar69 * fVar69 * fVar98 * -0.5 * fVar69;
  auVar168._0_4_ = fVar98 * auVar20._0_4_;
  auVar168._4_4_ = fVar98 * auVar20._4_4_;
  auVar168._8_4_ = fVar98 * auVar20._8_4_;
  auVar168._12_4_ = fVar98 * auVar20._12_4_;
  fVar98 = auVar18._0_4_;
  auVar225._0_4_ = fVar98 * auVar21._0_4_;
  auVar225._4_4_ = fVar98 * auVar21._4_4_;
  auVar225._8_4_ = fVar98 * auVar21._8_4_;
  auVar225._12_4_ = fVar98 * auVar21._12_4_;
  auVar20 = vsubps_avx(auVar168,auVar225);
  auVar18 = vrcpss_avx(auVar186,auVar186);
  auVar15 = vfnmadd213ss_fma(auVar15,auVar18,SUB6416(ZEXT464(0x40000000),0));
  fVar146 = auVar18._0_4_ * auVar15._0_4_;
  auVar186 = vpermilps_avx(auVar108,0xc9);
  fVar145 = auVar21._0_4_ * fVar69;
  fVar128 = auVar21._4_4_ * fVar69;
  fVar142 = auVar21._8_4_ * fVar69;
  fVar143 = auVar21._12_4_ * fVar69;
  auVar15 = vdpps_avx(auVar186,auVar186,0x7f);
  fVar96 = auVar15._0_4_;
  auVar187 = ZEXT416((uint)fVar96);
  auVar18 = vrsqrtss_avx(auVar187,auVar187);
  fVar98 = auVar18._0_4_;
  fVar98 = fVar96 * -0.5 * fVar98 * fVar98 * fVar98 + fVar98 * 1.5;
  auVar18 = vpermilps_avx(auVar147,0xc9);
  auVar315._0_4_ = fVar96 * auVar18._0_4_;
  auVar315._4_4_ = fVar96 * auVar18._4_4_;
  auVar315._8_4_ = fVar96 * auVar18._8_4_;
  auVar315._12_4_ = fVar96 * auVar18._12_4_;
  auVar18 = vdpps_avx(auVar186,auVar18,0x7f);
  fVar96 = auVar18._0_4_;
  auVar278._0_4_ = fVar96 * auVar186._0_4_;
  auVar278._4_4_ = fVar96 * auVar186._4_4_;
  auVar278._8_4_ = fVar96 * auVar186._8_4_;
  auVar278._12_4_ = fVar96 * auVar186._12_4_;
  auVar21 = vsubps_avx(auVar315,auVar278);
  auVar18 = vrcpss_avx(auVar187,auVar187);
  auVar15 = vfnmadd213ss_fma(auVar15,auVar18,SUB6416(ZEXT464(0x40000000),0));
  fVar96 = auVar18._0_4_ * auVar15._0_4_;
  fVar144 = auVar186._0_4_ * fVar98;
  fVar163 = auVar186._4_4_ * fVar98;
  fVar179 = auVar186._8_4_ * fVar98;
  fVar180 = auVar186._12_4_ * fVar98;
  auVar15 = vshufps_avx(auVar182,auVar182,0xff);
  auVar18 = vshufps_avx(auVar23,auVar23,0xff);
  auVar151._0_4_ = auVar18._0_4_ * fVar145;
  auVar151._4_4_ = auVar18._4_4_ * fVar128;
  auVar151._8_4_ = auVar18._8_4_ * fVar142;
  auVar151._12_4_ = auVar18._12_4_ * fVar143;
  auVar111._0_4_ = auVar15._0_4_ * fVar145 + auVar18._0_4_ * fVar69 * fVar146 * auVar20._0_4_;
  auVar111._4_4_ = auVar15._4_4_ * fVar128 + auVar18._4_4_ * fVar69 * fVar146 * auVar20._4_4_;
  auVar111._8_4_ = auVar15._8_4_ * fVar142 + auVar18._8_4_ * fVar69 * fVar146 * auVar20._8_4_;
  auVar111._12_4_ = auVar15._12_4_ * fVar143 + auVar18._12_4_ * fVar69 * fVar146 * auVar20._12_4_;
  auVar20 = vsubps_avx(auVar23,auVar151);
  fVar146 = auVar23._0_4_ + auVar151._0_4_;
  fVar145 = auVar23._4_4_ + auVar151._4_4_;
  fVar128 = auVar23._8_4_ + auVar151._8_4_;
  fVar142 = auVar23._12_4_ + auVar151._12_4_;
  auVar186 = vsubps_avx(auVar182,auVar111);
  auVar15 = vshufps_avx(auVar192,auVar192,0xff);
  auVar18 = vshufps_avx(auVar165,auVar165,0xff);
  auVar169._0_4_ = auVar18._0_4_ * fVar144;
  auVar169._4_4_ = auVar18._4_4_ * fVar163;
  auVar169._8_4_ = auVar18._8_4_ * fVar179;
  auVar169._12_4_ = auVar18._12_4_ * fVar180;
  auVar112._0_4_ = auVar15._0_4_ * fVar144 + auVar18._0_4_ * fVar98 * auVar21._0_4_ * fVar96;
  auVar112._4_4_ = auVar15._4_4_ * fVar163 + auVar18._4_4_ * fVar98 * auVar21._4_4_ * fVar96;
  auVar112._8_4_ = auVar15._8_4_ * fVar179 + auVar18._8_4_ * fVar98 * auVar21._8_4_ * fVar96;
  auVar112._12_4_ = auVar15._12_4_ * fVar180 + auVar18._12_4_ * fVar98 * auVar21._12_4_ * fVar96;
  auVar15 = vsubps_avx(auVar165,auVar169);
  auVar170._0_4_ = auVar165._0_4_ + auVar169._0_4_;
  auVar170._4_4_ = auVar165._4_4_ + auVar169._4_4_;
  auVar170._8_4_ = auVar165._8_4_ + auVar169._8_4_;
  auVar170._12_4_ = auVar165._12_4_ + auVar169._12_4_;
  auVar18 = vsubps_avx(auVar192,auVar112);
  local_5e0 = auVar185._0_4_;
  fStack_5dc = auVar185._4_4_;
  fStack_5d8 = auVar185._8_4_;
  fStack_5d4 = auVar185._12_4_;
  auVar300._0_4_ = auVar17._0_4_ + local_5e0 * 0.33333334;
  auVar300._4_4_ = auVar17._4_4_ + fStack_5dc * 0.33333334;
  auVar300._8_4_ = auVar17._8_4_ + fStack_5d8 * 0.33333334;
  auVar300._12_4_ = auVar17._12_4_ + fStack_5d4 * 0.33333334;
  fVar69 = 1.0 - fVar95;
  auVar113._4_4_ = fVar69;
  auVar113._0_4_ = fVar69;
  auVar113._8_4_ = fVar69;
  auVar113._12_4_ = fVar69;
  auVar226._0_4_ = fVar95 * auVar20._0_4_;
  auVar226._4_4_ = fVar95 * auVar20._4_4_;
  auVar226._8_4_ = fVar95 * auVar20._8_4_;
  auVar226._12_4_ = fVar95 * auVar20._12_4_;
  auVar23 = vfmadd231ps_fma(auVar226,auVar113,auVar17);
  auVar132._0_4_ = fVar95 * (auVar20._0_4_ + auVar186._0_4_ * 0.33333334);
  auVar132._4_4_ = fVar95 * (auVar20._4_4_ + auVar186._4_4_ * 0.33333334);
  auVar132._8_4_ = fVar95 * (auVar20._8_4_ + auVar186._8_4_ * 0.33333334);
  auVar132._12_4_ = fVar95 * (auVar20._12_4_ + auVar186._12_4_ * 0.33333334);
  auVar165 = vfmadd231ps_fma(auVar132,auVar113,auVar300);
  local_620._0_4_ = auVar22._0_4_;
  local_620._4_4_ = auVar22._4_4_;
  uStack_618._0_4_ = auVar22._8_4_;
  uStack_618._4_4_ = auVar22._12_4_;
  auVar133._0_4_ = (float)local_620._0_4_ * 0.33333334;
  auVar133._4_4_ = (float)local_620._4_4_ * 0.33333334;
  auVar133._8_4_ = (float)uStack_618 * 0.33333334;
  auVar133._12_4_ = uStack_618._4_4_ * 0.33333334;
  auVar20 = vsubps_avx(auVar19,auVar133);
  auVar301._0_4_ = (float)local_760._0_4_ + (fVar240 + auVar75._0_4_) * 0.33333334;
  auVar301._4_4_ = (float)local_760._4_4_ + (fVar241 + auVar75._4_4_) * 0.33333334;
  auVar301._8_4_ = (float)uStack_758 + (fVar97 + auVar75._8_4_) * 0.33333334;
  auVar301._12_4_ = uStack_758._4_4_ + (fVar285 + auVar75._12_4_) * 0.33333334;
  auVar266._0_4_ = (fVar295 + auVar150._0_4_) * 0.33333334;
  auVar266._4_4_ = (fVar310 + auVar150._4_4_) * 0.33333334;
  auVar266._8_4_ = (fVar311 + auVar150._8_4_) * 0.33333334;
  auVar266._12_4_ = (fVar312 + auVar150._12_4_) * 0.33333334;
  auVar21 = vsubps_avx(_local_700,auVar266);
  auVar279._0_4_ = auVar18._0_4_ * 0.33333334;
  auVar279._4_4_ = auVar18._4_4_ * 0.33333334;
  auVar279._8_4_ = auVar18._8_4_ * 0.33333334;
  auVar279._12_4_ = auVar18._12_4_ * 0.33333334;
  auVar18 = vsubps_avx(auVar15,auVar279);
  auVar246._0_4_ = (fVar220 + auVar112._0_4_) * 0.33333334;
  auVar246._4_4_ = (fVar218 + auVar112._4_4_) * 0.33333334;
  auVar246._8_4_ = (fVar219 + auVar112._8_4_) * 0.33333334;
  auVar246._12_4_ = (fVar235 + auVar112._12_4_) * 0.33333334;
  auVar186 = vsubps_avx(auVar170,auVar246);
  auVar280._0_4_ = fVar95 * auVar18._0_4_;
  auVar280._4_4_ = fVar95 * auVar18._4_4_;
  auVar280._8_4_ = fVar95 * auVar18._8_4_;
  auVar280._12_4_ = fVar95 * auVar18._12_4_;
  auVar204._0_4_ = fVar95 * auVar15._0_4_;
  auVar204._4_4_ = fVar95 * auVar15._4_4_;
  auVar204._8_4_ = fVar95 * auVar15._8_4_;
  auVar204._12_4_ = fVar95 * auVar15._12_4_;
  auVar22 = vfmadd231ps_fma(auVar280,auVar113,auVar20);
  auVar187 = vfmadd231ps_fma(auVar204,auVar113,auVar19);
  auVar134._0_4_ = fVar95 * fVar146;
  auVar134._4_4_ = fVar95 * fVar145;
  auVar134._8_4_ = fVar95 * fVar128;
  auVar134._12_4_ = fVar95 * fVar142;
  auVar152._0_4_ = fVar95 * (fVar146 + (fVar236 + auVar111._0_4_) * 0.33333334);
  auVar152._4_4_ = fVar95 * (fVar145 + (fVar237 + auVar111._4_4_) * 0.33333334);
  auVar152._8_4_ = fVar95 * (fVar128 + (fVar238 + auVar111._8_4_) * 0.33333334);
  auVar152._12_4_ = fVar95 * (fVar142 + (fVar239 + auVar111._12_4_) * 0.33333334);
  auVar188._0_4_ = fVar95 * auVar186._0_4_;
  auVar188._4_4_ = fVar95 * auVar186._4_4_;
  auVar188._8_4_ = fVar95 * auVar186._8_4_;
  auVar188._12_4_ = fVar95 * auVar186._12_4_;
  auVar171._0_4_ = fVar95 * auVar170._0_4_;
  auVar171._4_4_ = fVar95 * auVar170._4_4_;
  auVar171._8_4_ = fVar95 * auVar170._8_4_;
  auVar171._12_4_ = fVar95 * auVar170._12_4_;
  auVar71 = vfmadd231ps_fma(auVar134,auVar113,_local_760);
  auVar70 = vfmadd231ps_fma(auVar152,auVar113,auVar301);
  auVar100 = vfmadd231ps_fma(auVar188,auVar113,auVar21);
  auVar15 = vinsertps_avx(ZEXT416(*(uint *)(ray + k * 4)),ZEXT416(*(uint *)(ray + k * 4 + 0x20)),
                          0x1c);
  auVar101 = vfmadd231ps_fma(auVar171,auVar113,_local_700);
  auVar15 = vinsertps_avx(auVar15,ZEXT416(*(uint *)(ray + k * 4 + 0x40)),0x28);
  auVar17 = vsubps_avx(auVar23,auVar15);
  auVar18 = vshufps_avx(auVar17,auVar17,0x55);
  auVar19 = vshufps_avx(auVar17,auVar17,0xaa);
  aVar6 = pre->ray_space[k].vy.field_0;
  fVar69 = pre->ray_space[k].vz.field_0.m128[0];
  fVar98 = pre->ray_space[k].vz.field_0.m128[1];
  fVar95 = pre->ray_space[k].vz.field_0.m128[2];
  fVar146 = pre->ray_space[k].vz.field_0.m128[3];
  auVar77._0_4_ = fVar69 * auVar19._0_4_;
  auVar77._4_4_ = fVar98 * auVar19._4_4_;
  auVar77._8_4_ = fVar95 * auVar19._8_4_;
  auVar77._12_4_ = fVar146 * auVar19._12_4_;
  auVar20 = vfmadd231ps_fma(auVar77,(undefined1  [16])aVar6,auVar18);
  auVar185 = vsubps_avx(auVar165,auVar15);
  auVar18 = vshufps_avx(auVar185,auVar185,0x55);
  auVar19 = vshufps_avx(auVar185,auVar185,0xaa);
  auVar327._0_4_ = fVar69 * auVar19._0_4_;
  auVar327._4_4_ = fVar98 * auVar19._4_4_;
  auVar327._8_4_ = fVar95 * auVar19._8_4_;
  auVar327._12_4_ = fVar146 * auVar19._12_4_;
  auVar19 = vfmadd231ps_fma(auVar327,(undefined1  [16])aVar6,auVar18);
  local_3d0 = vsubps_avx(auVar22,auVar15);
  auVar18 = vshufps_avx(local_3d0,local_3d0,0xaa);
  auVar302._0_4_ = fVar69 * auVar18._0_4_;
  auVar302._4_4_ = fVar98 * auVar18._4_4_;
  auVar302._8_4_ = fVar95 * auVar18._8_4_;
  auVar302._12_4_ = fVar146 * auVar18._12_4_;
  auVar18 = vshufps_avx(local_3d0,local_3d0,0x55);
  auVar21 = vfmadd231ps_fma(auVar302,(undefined1  [16])aVar6,auVar18);
  local_3e0 = vsubps_avx(auVar187,auVar15);
  auVar18 = vshufps_avx(local_3e0,local_3e0,0xaa);
  auVar316._0_4_ = fVar69 * auVar18._0_4_;
  auVar316._4_4_ = fVar98 * auVar18._4_4_;
  auVar316._8_4_ = fVar95 * auVar18._8_4_;
  auVar316._12_4_ = fVar146 * auVar18._12_4_;
  auVar18 = vshufps_avx(local_3e0,local_3e0,0x55);
  auVar186 = vfmadd231ps_fma(auVar316,(undefined1  [16])aVar6,auVar18);
  local_3f0 = vsubps_avx(auVar71,auVar15);
  auVar18 = vshufps_avx(local_3f0,local_3f0,0xaa);
  auVar172._0_4_ = fVar69 * auVar18._0_4_;
  auVar172._4_4_ = fVar98 * auVar18._4_4_;
  auVar172._8_4_ = fVar95 * auVar18._8_4_;
  auVar172._12_4_ = fVar146 * auVar18._12_4_;
  auVar18 = vshufps_avx(local_3f0,local_3f0,0x55);
  auVar130 = vfmadd231ps_fma(auVar172,(undefined1  [16])aVar6,auVar18);
  local_400 = vsubps_avx(auVar70,auVar15);
  auVar18 = vshufps_avx(local_400,local_400,0xaa);
  auVar227._0_4_ = fVar69 * auVar18._0_4_;
  auVar227._4_4_ = fVar98 * auVar18._4_4_;
  auVar227._8_4_ = fVar95 * auVar18._8_4_;
  auVar227._12_4_ = fVar146 * auVar18._12_4_;
  auVar18 = vshufps_avx(local_400,local_400,0x55);
  auVar129 = vfmadd231ps_fma(auVar227,(undefined1  [16])aVar6,auVar18);
  local_410 = vsubps_avx(auVar100,auVar15);
  auVar18 = vshufps_avx(local_410,local_410,0xaa);
  auVar257._0_4_ = fVar69 * auVar18._0_4_;
  auVar257._4_4_ = fVar98 * auVar18._4_4_;
  auVar257._8_4_ = fVar95 * auVar18._8_4_;
  auVar257._12_4_ = fVar146 * auVar18._12_4_;
  auVar18 = vshufps_avx(local_410,local_410,0x55);
  auVar18 = vfmadd231ps_fma(auVar257,(undefined1  [16])aVar6,auVar18);
  local_420 = vsubps_avx(auVar101,auVar15);
  auVar15 = vshufps_avx(local_420,local_420,0xaa);
  auVar189._0_4_ = fVar69 * auVar15._0_4_;
  auVar189._4_4_ = fVar98 * auVar15._4_4_;
  auVar189._8_4_ = fVar95 * auVar15._8_4_;
  auVar189._12_4_ = fVar146 * auVar15._12_4_;
  auVar15 = vshufps_avx(local_420,local_420,0x55);
  auVar15 = vfmadd231ps_fma(auVar189,(undefined1  [16])aVar6,auVar15);
  local_510 = auVar17._0_4_;
  auVar205._4_4_ = local_510;
  auVar205._0_4_ = local_510;
  auVar205._8_4_ = local_510;
  auVar205._12_4_ = local_510;
  aVar6 = pre->ray_space[k].vx.field_0;
  auVar102 = vfmadd231ps_fma(auVar20,(undefined1  [16])aVar6,auVar205);
  local_520 = auVar185._0_4_;
  auVar206._4_4_ = local_520;
  auVar206._0_4_ = local_520;
  auVar206._8_4_ = local_520;
  auVar206._12_4_ = local_520;
  auVar108 = vfmadd231ps_fma(auVar19,(undefined1  [16])aVar6,auVar206);
  uVar67 = local_3d0._0_4_;
  auVar207._4_4_ = uVar67;
  auVar207._0_4_ = uVar67;
  auVar207._8_4_ = uVar67;
  auVar207._12_4_ = uVar67;
  auVar147 = vfmadd231ps_fma(auVar21,(undefined1  [16])aVar6,auVar207);
  uVar67 = local_3e0._0_4_;
  auVar208._4_4_ = uVar67;
  auVar208._0_4_ = uVar67;
  auVar208._8_4_ = uVar67;
  auVar208._12_4_ = uVar67;
  auVar286 = vfmadd231ps_fma(auVar186,(undefined1  [16])aVar6,auVar208);
  uVar67 = local_3f0._0_4_;
  auVar209._4_4_ = uVar67;
  auVar209._0_4_ = uVar67;
  auVar209._8_4_ = uVar67;
  auVar209._12_4_ = uVar67;
  auVar130 = vfmadd231ps_fma(auVar130,(undefined1  [16])aVar6,auVar209);
  uVar67 = local_400._0_4_;
  auVar210._4_4_ = uVar67;
  auVar210._0_4_ = uVar67;
  auVar210._8_4_ = uVar67;
  auVar210._12_4_ = uVar67;
  auVar129 = vfmadd231ps_fma(auVar129,(undefined1  [16])aVar6,auVar210);
  uVar67 = local_410._0_4_;
  auVar211._4_4_ = uVar67;
  auVar211._0_4_ = uVar67;
  auVar211._8_4_ = uVar67;
  auVar211._12_4_ = uVar67;
  auVar164 = vfmadd231ps_fma(auVar18,(undefined1  [16])aVar6,auVar211);
  uVar67 = local_420._0_4_;
  auVar212._4_4_ = uVar67;
  auVar212._0_4_ = uVar67;
  auVar212._8_4_ = uVar67;
  auVar212._12_4_ = uVar67;
  auVar182 = vfmadd231ps_fma(auVar15,(undefined1  [16])aVar6,auVar212);
  auVar20 = vmovlhps_avx(auVar102,auVar130);
  auVar21 = vmovlhps_avx(auVar108,auVar129);
  auVar186 = vmovlhps_avx(auVar147,auVar164);
  _local_3b0 = vmovlhps_avx(auVar286,auVar182);
  auVar15 = vminps_avx(auVar20,auVar21);
  auVar18 = vminps_avx(auVar186,_local_3b0);
  auVar19 = vminps_avx(auVar15,auVar18);
  auVar15 = vmaxps_avx(auVar20,auVar21);
  auVar18 = vmaxps_avx(auVar186,_local_3b0);
  auVar15 = vmaxps_avx(auVar15,auVar18);
  auVar18 = vshufpd_avx(auVar19,auVar19,3);
  auVar19 = vminps_avx(auVar19,auVar18);
  auVar18 = vshufpd_avx(auVar15,auVar15,3);
  auVar18 = vmaxps_avx(auVar15,auVar18);
  auVar15 = vandps_avx(auVar313,auVar19);
  auVar18 = vandps_avx(auVar18,auVar313);
  auVar15 = vmaxps_avx(auVar15,auVar18);
  auVar18 = vmovshdup_avx(auVar15);
  auVar15 = vmaxss_avx(auVar18,auVar15);
  local_1c0 = auVar15._0_4_ * 9.536743e-07;
  auVar247._8_8_ = auVar102._0_8_;
  auVar247._0_8_ = auVar102._0_8_;
  auVar267._8_8_ = auVar108._0_8_;
  auVar267._0_8_ = auVar108._0_8_;
  auVar303._0_8_ = auVar147._0_8_;
  auVar303._8_8_ = auVar303._0_8_;
  auVar317._0_8_ = auVar286._0_8_;
  auVar317._8_8_ = auVar317._0_8_;
  local_3c0 = ZEXT416((uint)local_1c0);
  fStack_1bc = local_1c0;
  fStack_1b8 = local_1c0;
  fStack_1b4 = local_1c0;
  fStack_1b0 = local_1c0;
  fStack_1ac = local_1c0;
  fStack_1a8 = local_1c0;
  fStack_1a4 = local_1c0;
  fStack_1d8 = -local_1c0;
  local_1e0 = -local_1c0;
  fStack_1dc = -local_1c0;
  fStack_1d4 = fStack_1d8;
  fStack_1d0 = fStack_1d8;
  fStack_1cc = fStack_1d8;
  fStack_1c8 = fStack_1d8;
  fStack_1c4 = fStack_1d8;
  local_320 = uVar57;
  uStack_31c = uVar57;
  uStack_318 = uVar57;
  uStack_314 = uVar57;
  uStack_310 = uVar57;
  uStack_30c = uVar57;
  uStack_308 = uVar57;
  uStack_304 = uVar57;
  uStack_33c = local_340;
  uStack_338 = local_340;
  uStack_334 = local_340;
  uStack_330 = local_340;
  uStack_32c = local_340;
  uStack_328 = local_340;
  uStack_324 = local_340;
  bVar68 = false;
  uVar62 = 0;
  fVar69 = *(float *)(ray + k * 4 + 0x60);
  auVar15 = vsubps_avx(auVar21,auVar20);
  local_390 = vsubps_avx(auVar186,auVar21);
  local_3a0 = vsubps_avx(_local_3b0,auVar186);
  local_450 = vsubps_avx(auVar71,auVar23);
  local_460 = vsubps_avx(auVar70,auVar165);
  local_470 = vsubps_avx(auVar100,auVar22);
  _local_480 = vsubps_avx(auVar101,auVar187);
  auVar78 = ZEXT816(0x3f80000000000000);
  local_430 = auVar78;
LAB_0124199e:
  auVar18 = vshufps_avx(auVar78,auVar78,0x50);
  auVar328._8_4_ = 0x3f800000;
  auVar328._0_8_ = 0x3f8000003f800000;
  auVar328._12_4_ = 0x3f800000;
  auVar331._16_4_ = 0x3f800000;
  auVar331._0_16_ = auVar328;
  auVar331._20_4_ = 0x3f800000;
  auVar331._24_4_ = 0x3f800000;
  auVar331._28_4_ = 0x3f800000;
  auVar19 = vsubps_avx(auVar328,auVar18);
  fVar98 = auVar18._0_4_;
  fVar144 = auVar130._0_4_;
  auVar79._0_4_ = fVar144 * fVar98;
  fVar95 = auVar18._4_4_;
  fVar163 = auVar130._4_4_;
  auVar79._4_4_ = fVar163 * fVar95;
  fVar146 = auVar18._8_4_;
  auVar79._8_4_ = fVar144 * fVar146;
  fVar96 = auVar18._12_4_;
  auVar79._12_4_ = fVar163 * fVar96;
  fVar181 = auVar129._0_4_;
  auVar213._0_4_ = fVar181 * fVar98;
  fVar218 = auVar129._4_4_;
  auVar213._4_4_ = fVar218 * fVar95;
  auVar213._8_4_ = fVar181 * fVar146;
  auVar213._12_4_ = fVar218 * fVar96;
  fVar219 = auVar164._0_4_;
  auVar173._0_4_ = fVar219 * fVar98;
  fVar235 = auVar164._4_4_;
  auVar173._4_4_ = fVar235 * fVar95;
  auVar173._8_4_ = fVar219 * fVar146;
  auVar173._12_4_ = fVar235 * fVar96;
  fVar179 = auVar182._0_4_;
  auVar135._0_4_ = fVar179 * fVar98;
  fVar180 = auVar182._4_4_;
  auVar135._4_4_ = fVar180 * fVar95;
  auVar135._8_4_ = fVar179 * fVar146;
  auVar135._12_4_ = fVar180 * fVar96;
  auVar147 = vfmadd231ps_fma(auVar79,auVar19,auVar247);
  auVar286 = vfmadd231ps_fma(auVar213,auVar19,auVar267);
  auVar192 = vfmadd231ps_fma(auVar173,auVar19,auVar303);
  auVar201 = vfmadd231ps_fma(auVar135,auVar317,auVar19);
  auVar18 = vmovshdup_avx(local_430);
  fVar98 = local_430._0_4_;
  fStack_288 = (auVar18._0_4_ - fVar98) * 0.04761905;
  auVar265._4_4_ = fVar98;
  auVar265._0_4_ = fVar98;
  auVar265._8_4_ = fVar98;
  auVar265._12_4_ = fVar98;
  auVar265._16_4_ = fVar98;
  auVar265._20_4_ = fVar98;
  auVar265._24_4_ = fVar98;
  auVar265._28_4_ = fVar98;
  auVar123._0_8_ = auVar18._0_8_;
  auVar123._8_8_ = auVar123._0_8_;
  auVar123._16_8_ = auVar123._0_8_;
  auVar123._24_8_ = auVar123._0_8_;
  auVar91 = vsubps_avx(auVar123,auVar265);
  uVar67 = auVar147._0_4_;
  auVar321._4_4_ = uVar67;
  auVar321._0_4_ = uVar67;
  auVar321._8_4_ = uVar67;
  auVar321._12_4_ = uVar67;
  auVar321._16_4_ = uVar67;
  auVar321._20_4_ = uVar67;
  auVar321._24_4_ = uVar67;
  auVar321._28_4_ = uVar67;
  auVar18 = vmovshdup_avx(auVar147);
  uVar99 = auVar18._0_8_;
  auVar309._8_8_ = uVar99;
  auVar309._0_8_ = uVar99;
  auVar309._16_8_ = uVar99;
  auVar309._24_8_ = uVar99;
  fVar220 = auVar286._0_4_;
  auVar292._4_4_ = fVar220;
  auVar292._0_4_ = fVar220;
  auVar292._8_4_ = fVar220;
  auVar292._12_4_ = fVar220;
  auVar292._16_4_ = fVar220;
  auVar292._20_4_ = fVar220;
  auVar292._24_4_ = fVar220;
  auVar292._28_4_ = fVar220;
  auVar19 = vmovshdup_avx(auVar286);
  auVar124._0_8_ = auVar19._0_8_;
  auVar124._8_8_ = auVar124._0_8_;
  auVar124._16_8_ = auVar124._0_8_;
  auVar124._24_8_ = auVar124._0_8_;
  fVar143 = auVar192._0_4_;
  auVar232._4_4_ = fVar143;
  auVar232._0_4_ = fVar143;
  auVar232._8_4_ = fVar143;
  auVar232._12_4_ = fVar143;
  auVar232._16_4_ = fVar143;
  auVar232._20_4_ = fVar143;
  auVar232._24_4_ = fVar143;
  auVar232._28_4_ = fVar143;
  auVar102 = vmovshdup_avx(auVar192);
  auVar253._0_8_ = auVar102._0_8_;
  auVar253._8_8_ = auVar253._0_8_;
  auVar253._16_8_ = auVar253._0_8_;
  auVar253._24_8_ = auVar253._0_8_;
  fVar142 = auVar201._0_4_;
  auVar108 = vmovshdup_avx(auVar201);
  auVar281 = vfmadd132ps_fma(auVar91,auVar265,_DAT_01f7b040);
  auVar91 = vsubps_avx(auVar331,ZEXT1632(auVar281));
  fVar98 = auVar281._0_4_;
  fVar95 = auVar281._4_4_;
  auVar25._4_4_ = fVar220 * fVar95;
  auVar25._0_4_ = fVar220 * fVar98;
  fVar146 = auVar281._8_4_;
  auVar25._8_4_ = fVar220 * fVar146;
  fVar96 = auVar281._12_4_;
  auVar25._12_4_ = fVar220 * fVar96;
  auVar25._16_4_ = fVar220 * 0.0;
  auVar25._20_4_ = fVar220 * 0.0;
  auVar25._24_4_ = fVar220 * 0.0;
  auVar25._28_4_ = 0x3f800000;
  auVar281 = vfmadd231ps_fma(auVar25,auVar91,auVar321);
  fVar145 = auVar19._0_4_;
  fVar128 = auVar19._4_4_;
  auVar24._4_4_ = fVar128 * fVar95;
  auVar24._0_4_ = fVar145 * fVar98;
  auVar24._8_4_ = fVar145 * fVar146;
  auVar24._12_4_ = fVar128 * fVar96;
  auVar24._16_4_ = fVar145 * 0.0;
  auVar24._20_4_ = fVar128 * 0.0;
  auVar24._24_4_ = fVar145 * 0.0;
  auVar24._28_4_ = uVar67;
  auVar242 = vfmadd231ps_fma(auVar24,auVar91,auVar309);
  auVar16._4_4_ = fVar143 * fVar95;
  auVar16._0_4_ = fVar143 * fVar98;
  auVar16._8_4_ = fVar143 * fVar146;
  auVar16._12_4_ = fVar143 * fVar96;
  auVar16._16_4_ = fVar143 * 0.0;
  auVar16._20_4_ = fVar143 * 0.0;
  auVar16._24_4_ = fVar143 * 0.0;
  auVar16._28_4_ = auVar18._4_4_;
  auVar243 = vfmadd231ps_fma(auVar16,auVar91,auVar292);
  fVar145 = auVar102._0_4_;
  fVar128 = auVar102._4_4_;
  auVar26._4_4_ = fVar128 * fVar95;
  auVar26._0_4_ = fVar145 * fVar98;
  auVar26._8_4_ = fVar145 * fVar146;
  auVar26._12_4_ = fVar128 * fVar96;
  auVar26._16_4_ = fVar145 * 0.0;
  auVar26._20_4_ = fVar128 * 0.0;
  auVar26._24_4_ = fVar145 * 0.0;
  auVar26._28_4_ = fVar220;
  auVar154 = vfmadd231ps_fma(auVar26,auVar91,auVar124);
  auVar18 = vshufps_avx(auVar147,auVar147,0xaa);
  uStack_6f8 = auVar18._0_8_;
  local_700 = (undefined1  [8])uStack_6f8;
  uStack_6f0 = uStack_6f8;
  uStack_6e8 = uStack_6f8;
  auVar19 = vshufps_avx(auVar147,auVar147,0xff);
  uStack_758 = auVar19._0_8_;
  local_760 = (undefined1  [8])uStack_758;
  uStack_750 = uStack_758;
  uStack_748 = uStack_758;
  auVar27._4_4_ = fVar142 * fVar95;
  auVar27._0_4_ = fVar142 * fVar98;
  auVar27._8_4_ = fVar142 * fVar146;
  auVar27._12_4_ = fVar142 * fVar96;
  auVar27._16_4_ = fVar142 * 0.0;
  auVar27._20_4_ = fVar142 * 0.0;
  auVar27._24_4_ = fVar142 * 0.0;
  auVar27._28_4_ = fVar142;
  auVar147 = vfmadd231ps_fma(auVar27,auVar91,auVar232);
  auVar19 = vshufps_avx(auVar286,auVar286,0xaa);
  auVar233._0_8_ = auVar19._0_8_;
  auVar233._8_8_ = auVar233._0_8_;
  auVar233._16_8_ = auVar233._0_8_;
  auVar233._24_8_ = auVar233._0_8_;
  auVar102 = vshufps_avx(auVar286,auVar286,0xff);
  uStack_618 = auVar102._0_8_;
  local_620 = (undefined1  [8])uStack_618;
  uStack_610 = uStack_618;
  uStack_608 = uStack_618;
  fVar145 = auVar108._0_4_;
  fVar128 = auVar108._4_4_;
  auVar28._4_4_ = fVar128 * fVar95;
  auVar28._0_4_ = fVar145 * fVar98;
  auVar28._8_4_ = fVar145 * fVar146;
  auVar28._12_4_ = fVar128 * fVar96;
  auVar28._16_4_ = fVar145 * 0.0;
  auVar28._20_4_ = fVar128 * 0.0;
  auVar28._24_4_ = fVar145 * 0.0;
  auVar28._28_4_ = auVar18._4_4_;
  auVar255 = vfmadd231ps_fma(auVar28,auVar91,auVar253);
  auVar29._28_4_ = fVar128;
  auVar29._0_28_ =
       ZEXT1628(CONCAT412(auVar243._12_4_ * fVar96,
                          CONCAT48(auVar243._8_4_ * fVar146,
                                   CONCAT44(auVar243._4_4_ * fVar95,auVar243._0_4_ * fVar98))));
  auVar281 = vfmadd231ps_fma(auVar29,auVar91,ZEXT1632(auVar281));
  fVar145 = auVar102._4_4_;
  auVar30._28_4_ = fVar145;
  auVar30._0_28_ =
       ZEXT1628(CONCAT412(auVar154._12_4_ * fVar96,
                          CONCAT48(auVar154._8_4_ * fVar146,
                                   CONCAT44(auVar154._4_4_ * fVar95,auVar154._0_4_ * fVar98))));
  auVar242 = vfmadd231ps_fma(auVar30,auVar91,ZEXT1632(auVar242));
  auVar18 = vshufps_avx(auVar192,auVar192,0xaa);
  uVar99 = auVar18._0_8_;
  auVar217._8_8_ = uVar99;
  auVar217._0_8_ = uVar99;
  auVar217._16_8_ = uVar99;
  auVar217._24_8_ = uVar99;
  auVar108 = vshufps_avx(auVar192,auVar192,0xff);
  uVar99 = auVar108._0_8_;
  auVar332._8_8_ = uVar99;
  auVar332._0_8_ = uVar99;
  auVar332._16_8_ = uVar99;
  auVar332._24_8_ = uVar99;
  auVar192 = vfmadd231ps_fma(ZEXT1632(CONCAT412(auVar147._12_4_ * fVar96,
                                                CONCAT48(auVar147._8_4_ * fVar146,
                                                         CONCAT44(auVar147._4_4_ * fVar95,
                                                                  auVar147._0_4_ * fVar98)))),
                             auVar91,ZEXT1632(auVar243));
  auVar147 = vshufps_avx(auVar201,auVar201,0xaa);
  auVar286 = vshufps_avx(auVar201,auVar201,0xff);
  auVar201 = vfmadd231ps_fma(ZEXT1632(CONCAT412(fVar96 * auVar255._12_4_,
                                                CONCAT48(fVar146 * auVar255._8_4_,
                                                         CONCAT44(fVar95 * auVar255._4_4_,
                                                                  fVar98 * auVar255._0_4_)))),
                             auVar91,ZEXT1632(auVar154));
  auVar243 = vfmadd231ps_fma(ZEXT1632(CONCAT412(fVar96 * auVar192._12_4_,
                                                CONCAT48(fVar146 * auVar192._8_4_,
                                                         CONCAT44(fVar95 * auVar192._4_4_,
                                                                  fVar98 * auVar192._0_4_)))),
                             auVar91,ZEXT1632(auVar281));
  auVar25 = vsubps_avx(ZEXT1632(auVar192),ZEXT1632(auVar281));
  auVar192 = vfmadd231ps_fma(ZEXT1632(CONCAT412(fVar96 * auVar201._12_4_,
                                                CONCAT48(fVar146 * auVar201._8_4_,
                                                         CONCAT44(fVar95 * auVar201._4_4_,
                                                                  fVar98 * auVar201._0_4_)))),
                             auVar91,ZEXT1632(auVar242));
  auVar92 = vsubps_avx(ZEXT1632(auVar201),ZEXT1632(auVar242));
  fStack_5e4 = auVar92._28_4_;
  auVar293._0_4_ = fStack_288 * auVar25._0_4_ * 3.0;
  auVar293._4_4_ = fStack_288 * auVar25._4_4_ * 3.0;
  auVar293._8_4_ = fStack_288 * auVar25._8_4_ * 3.0;
  auVar293._12_4_ = fStack_288 * auVar25._12_4_ * 3.0;
  auVar293._16_4_ = fStack_288 * auVar25._16_4_ * 3.0;
  auVar293._20_4_ = fStack_288 * auVar25._20_4_ * 3.0;
  auVar293._24_4_ = fStack_288 * auVar25._24_4_ * 3.0;
  auVar293._28_4_ = 0;
  local_600._0_4_ = fStack_288 * auVar92._0_4_ * 3.0;
  local_600._4_4_ = fStack_288 * auVar92._4_4_ * 3.0;
  fStack_5f8 = fStack_288 * auVar92._8_4_ * 3.0;
  fStack_5f4 = fStack_288 * auVar92._12_4_ * 3.0;
  fStack_5f0 = fStack_288 * auVar92._16_4_ * 3.0;
  fStack_5ec = fStack_288 * auVar92._20_4_ * 3.0;
  fStack_5e8 = fStack_288 * auVar92._24_4_ * 3.0;
  fVar128 = auVar19._0_4_;
  fVar142 = auVar19._4_4_;
  auVar294._4_4_ = fVar142 * fVar95;
  auVar294._0_4_ = fVar128 * fVar98;
  auVar294._8_4_ = fVar128 * fVar146;
  auVar294._12_4_ = fVar142 * fVar96;
  auVar294._16_4_ = fVar128 * 0.0;
  auVar294._20_4_ = fVar142 * 0.0;
  auVar294._24_4_ = fVar128 * 0.0;
  auVar294._28_4_ = fStack_5e4;
  auVar19 = vfmadd231ps_fma(auVar294,auVar91,_local_700);
  fVar128 = auVar102._0_4_;
  auVar31._4_4_ = fVar145 * fVar95;
  auVar31._0_4_ = fVar128 * fVar98;
  auVar31._8_4_ = fVar128 * fVar146;
  auVar31._12_4_ = fVar145 * fVar96;
  auVar31._16_4_ = fVar128 * 0.0;
  auVar31._20_4_ = fVar145 * 0.0;
  auVar31._24_4_ = fVar128 * 0.0;
  auVar31._28_4_ = 0;
  auVar102 = vfmadd231ps_fma(auVar31,auVar91,_local_760);
  fVar145 = auVar18._0_4_;
  fVar128 = auVar18._4_4_;
  auVar32._4_4_ = fVar128 * fVar95;
  auVar32._0_4_ = fVar145 * fVar98;
  auVar32._8_4_ = fVar145 * fVar146;
  auVar32._12_4_ = fVar128 * fVar96;
  auVar32._16_4_ = fVar145 * 0.0;
  auVar32._20_4_ = fVar128 * 0.0;
  auVar32._24_4_ = fVar145 * 0.0;
  auVar32._28_4_ = auVar25._28_4_;
  auVar18 = vfmadd231ps_fma(auVar32,auVar91,auVar233);
  fVar145 = auVar108._0_4_;
  fVar143 = auVar108._4_4_;
  auVar33._4_4_ = fVar143 * fVar95;
  auVar33._0_4_ = fVar145 * fVar98;
  auVar33._8_4_ = fVar145 * fVar146;
  auVar33._12_4_ = fVar143 * fVar96;
  auVar33._16_4_ = fVar145 * 0.0;
  auVar33._20_4_ = fVar143 * 0.0;
  auVar33._24_4_ = fVar145 * 0.0;
  auVar33._28_4_ = fVar142;
  auVar108 = vfmadd231ps_fma(auVar33,auVar91,_local_620);
  auVar26 = vpermps_avx2(_DAT_01fb7720,ZEXT1632(auVar243));
  fVar145 = auVar147._0_4_;
  fVar128 = auVar147._4_4_;
  auVar34._4_4_ = fVar128 * fVar95;
  auVar34._0_4_ = fVar145 * fVar98;
  auVar34._8_4_ = fVar145 * fVar146;
  auVar34._12_4_ = fVar128 * fVar96;
  auVar34._16_4_ = fVar145 * 0.0;
  auVar34._20_4_ = fVar128 * 0.0;
  auVar34._24_4_ = fVar145 * 0.0;
  auVar34._28_4_ = fVar128;
  auVar147 = vfmadd231ps_fma(auVar34,auVar91,auVar217);
  auVar27 = vpermps_avx2(_DAT_01fb7720,ZEXT1632(auVar192));
  fVar145 = auVar286._0_4_;
  fVar128 = auVar286._4_4_;
  auVar35._4_4_ = fVar128 * fVar95;
  auVar35._0_4_ = fVar145 * fVar98;
  auVar35._8_4_ = fVar145 * fVar146;
  auVar35._12_4_ = fVar128 * fVar96;
  auVar35._16_4_ = fVar145 * 0.0;
  auVar35._20_4_ = fVar128 * 0.0;
  auVar35._24_4_ = fVar145 * 0.0;
  auVar35._28_4_ = fVar128;
  auVar286 = vfmadd231ps_fma(auVar35,auVar91,auVar332);
  auVar36._28_4_ = fVar143;
  auVar36._0_28_ =
       ZEXT1628(CONCAT412(auVar18._12_4_ * fVar96,
                          CONCAT48(auVar18._8_4_ * fVar146,
                                   CONCAT44(auVar18._4_4_ * fVar95,auVar18._0_4_ * fVar98))));
  auVar19 = vfmadd231ps_fma(auVar36,auVar91,ZEXT1632(auVar19));
  auVar102 = vfmadd231ps_fma(ZEXT1632(CONCAT412(fVar96 * auVar108._12_4_,
                                                CONCAT48(fVar146 * auVar108._8_4_,
                                                         CONCAT44(fVar95 * auVar108._4_4_,
                                                                  fVar98 * auVar108._0_4_)))),
                             auVar91,ZEXT1632(auVar102));
  auVar125._0_4_ = auVar243._0_4_ + auVar293._0_4_;
  auVar125._4_4_ = auVar243._4_4_ + auVar293._4_4_;
  auVar125._8_4_ = auVar243._8_4_ + auVar293._8_4_;
  auVar125._12_4_ = auVar243._12_4_ + auVar293._12_4_;
  auVar125._16_4_ = auVar293._16_4_ + 0.0;
  auVar125._20_4_ = auVar293._20_4_ + 0.0;
  auVar125._24_4_ = auVar293._24_4_ + 0.0;
  auVar125._28_4_ = 0;
  auVar18 = vfmadd231ps_fma(ZEXT1632(CONCAT412(auVar147._12_4_ * fVar96,
                                               CONCAT48(auVar147._8_4_ * fVar146,
                                                        CONCAT44(auVar147._4_4_ * fVar95,
                                                                 auVar147._0_4_ * fVar98)))),auVar91
                            ,ZEXT1632(auVar18));
  auVar108 = vfmadd231ps_fma(ZEXT1632(CONCAT412(auVar286._12_4_ * fVar96,
                                                CONCAT48(auVar286._8_4_ * fVar146,
                                                         CONCAT44(auVar286._4_4_ * fVar95,
                                                                  auVar286._0_4_ * fVar98)))),
                             auVar91,ZEXT1632(auVar108));
  auVar147 = vfmadd231ps_fma(ZEXT1632(CONCAT412(fVar96 * auVar18._12_4_,
                                                CONCAT48(fVar146 * auVar18._8_4_,
                                                         CONCAT44(fVar95 * auVar18._4_4_,
                                                                  fVar98 * auVar18._0_4_)))),auVar91
                             ,ZEXT1632(auVar19));
  auVar286 = vfmadd231ps_fma(ZEXT1632(CONCAT412(auVar108._12_4_ * fVar96,
                                                CONCAT48(auVar108._8_4_ * fVar146,
                                                         CONCAT44(auVar108._4_4_ * fVar95,
                                                                  auVar108._0_4_ * fVar98)))),
                             ZEXT1632(auVar102),auVar91);
  auVar91 = vsubps_avx(ZEXT1632(auVar18),ZEXT1632(auVar19));
  auVar25 = vsubps_avx(ZEXT1632(auVar108),ZEXT1632(auVar102));
  auVar322._0_4_ = fStack_288 * auVar91._0_4_ * 3.0;
  auVar322._4_4_ = fStack_288 * auVar91._4_4_ * 3.0;
  auVar322._8_4_ = fStack_288 * auVar91._8_4_ * 3.0;
  auVar322._12_4_ = fStack_288 * auVar91._12_4_ * 3.0;
  auVar322._16_4_ = fStack_288 * auVar91._16_4_ * 3.0;
  auVar322._20_4_ = fStack_288 * auVar91._20_4_ * 3.0;
  auVar322._24_4_ = fStack_288 * auVar91._24_4_ * 3.0;
  auVar322._28_4_ = 0;
  local_2a0 = fStack_288 * auVar25._0_4_ * 3.0;
  fStack_29c = fStack_288 * auVar25._4_4_ * 3.0;
  auVar37._4_4_ = fStack_29c;
  auVar37._0_4_ = local_2a0;
  fStack_298 = fStack_288 * auVar25._8_4_ * 3.0;
  auVar37._8_4_ = fStack_298;
  fStack_294 = fStack_288 * auVar25._12_4_ * 3.0;
  auVar37._12_4_ = fStack_294;
  fStack_290 = fStack_288 * auVar25._16_4_ * 3.0;
  auVar37._16_4_ = fStack_290;
  fStack_28c = fStack_288 * auVar25._20_4_ * 3.0;
  auVar37._20_4_ = fStack_28c;
  fStack_288 = fStack_288 * auVar25._24_4_ * 3.0;
  auVar37._24_4_ = fStack_288;
  auVar37._28_4_ = 0x40400000;
  auVar28 = vpermps_avx2(_DAT_01fb7720,ZEXT1632(auVar147));
  auVar29 = vpermps_avx2(_DAT_01fb7720,ZEXT1632(auVar286));
  auVar91 = vsubps_avx(ZEXT1632(auVar147),ZEXT1632(auVar243));
  auVar25 = vsubps_avx(ZEXT1632(auVar286),ZEXT1632(auVar192));
  auVar92 = vsubps_avx(auVar28,auVar26);
  fVar220 = auVar91._0_4_ + auVar92._0_4_;
  fVar236 = auVar91._4_4_ + auVar92._4_4_;
  fVar237 = auVar91._8_4_ + auVar92._8_4_;
  fVar238 = auVar91._12_4_ + auVar92._12_4_;
  fVar239 = auVar91._16_4_ + auVar92._16_4_;
  fVar240 = auVar91._20_4_ + auVar92._20_4_;
  fVar241 = auVar91._24_4_ + auVar92._24_4_;
  auVar24 = vsubps_avx(auVar29,auVar27);
  auVar93._0_4_ = auVar25._0_4_ + auVar24._0_4_;
  auVar93._4_4_ = auVar25._4_4_ + auVar24._4_4_;
  auVar93._8_4_ = auVar25._8_4_ + auVar24._8_4_;
  auVar93._12_4_ = auVar25._12_4_ + auVar24._12_4_;
  auVar93._16_4_ = auVar25._16_4_ + auVar24._16_4_;
  auVar93._20_4_ = auVar25._20_4_ + auVar24._20_4_;
  auVar93._24_4_ = auVar25._24_4_ + auVar24._24_4_;
  auVar93._28_4_ = auVar25._28_4_ + auVar24._28_4_;
  local_240 = ZEXT1632(auVar192);
  fVar98 = auVar192._0_4_;
  local_2c0 = (float)local_600._0_4_ + fVar98;
  fVar95 = auVar192._4_4_;
  fStack_2bc = (float)local_600._4_4_ + fVar95;
  fVar146 = auVar192._8_4_;
  fStack_2b8 = fStack_5f8 + fVar146;
  fVar96 = auVar192._12_4_;
  fStack_2b4 = fStack_5f4 + fVar96;
  fStack_2b0 = fStack_5f0 + 0.0;
  fStack_2ac = fStack_5ec + 0.0;
  fStack_2a8 = fStack_5e8 + 0.0;
  local_200 = ZEXT1632(auVar243);
  auVar25 = vsubps_avx(local_200,auVar293);
  local_220 = vpermps_avx2(_DAT_01fb7720,auVar25);
  auVar25 = vsubps_avx(local_240,_local_600);
  local_2e0 = vpermps_avx2(_DAT_01fb7720,auVar25);
  local_260._0_4_ = auVar147._0_4_ + auVar322._0_4_;
  local_260._4_4_ = auVar147._4_4_ + auVar322._4_4_;
  local_260._8_4_ = auVar147._8_4_ + auVar322._8_4_;
  local_260._12_4_ = auVar147._12_4_ + auVar322._12_4_;
  local_260._16_4_ = auVar322._16_4_ + 0.0;
  local_260._20_4_ = auVar322._20_4_ + 0.0;
  local_260._24_4_ = auVar322._24_4_ + 0.0;
  local_260._28_4_ = 0;
  auVar294 = ZEXT1632(auVar147);
  auVar25 = vsubps_avx(auVar294,auVar322);
  auVar30 = vpermps_avx2(_DAT_01fb7720,auVar25);
  fVar145 = auVar286._0_4_;
  local_2a0 = fVar145 + local_2a0;
  fVar128 = auVar286._4_4_;
  fStack_29c = fVar128 + fStack_29c;
  fVar142 = auVar286._8_4_;
  fStack_298 = fVar142 + fStack_298;
  fVar143 = auVar286._12_4_;
  fStack_294 = fVar143 + fStack_294;
  fStack_290 = fStack_290 + 0.0;
  fStack_28c = fStack_28c + 0.0;
  fStack_288 = fStack_288 + 0.0;
  auVar25 = vsubps_avx(ZEXT1632(auVar286),auVar37);
  local_280 = vpermps_avx2(_DAT_01fb7720,auVar25);
  auVar38._4_4_ = fVar95 * fVar236;
  auVar38._0_4_ = fVar98 * fVar220;
  auVar38._8_4_ = fVar146 * fVar237;
  auVar38._12_4_ = fVar96 * fVar238;
  auVar38._16_4_ = fVar239 * 0.0;
  auVar38._20_4_ = fVar240 * 0.0;
  auVar38._24_4_ = fVar241 * 0.0;
  auVar38._28_4_ = auVar25._28_4_;
  auVar18 = vfnmadd231ps_fma(auVar38,local_200,auVar93);
  fStack_2a4 = fStack_5e4 + 0.0;
  auVar39._4_4_ = fStack_2bc * fVar236;
  auVar39._0_4_ = local_2c0 * fVar220;
  auVar39._8_4_ = fStack_2b8 * fVar237;
  auVar39._12_4_ = fStack_2b4 * fVar238;
  auVar39._16_4_ = fStack_2b0 * fVar239;
  auVar39._20_4_ = fStack_2ac * fVar240;
  auVar39._24_4_ = fStack_2a8 * fVar241;
  auVar39._28_4_ = 0;
  auVar19 = vfnmadd231ps_fma(auVar39,auVar93,auVar125);
  auVar40._4_4_ = local_2e0._4_4_ * fVar236;
  auVar40._0_4_ = local_2e0._0_4_ * fVar220;
  auVar40._8_4_ = local_2e0._8_4_ * fVar237;
  auVar40._12_4_ = local_2e0._12_4_ * fVar238;
  auVar40._16_4_ = local_2e0._16_4_ * fVar239;
  auVar40._20_4_ = local_2e0._20_4_ * fVar240;
  auVar40._24_4_ = local_2e0._24_4_ * fVar241;
  auVar40._28_4_ = fStack_5e4 + 0.0;
  auVar102 = vfnmadd231ps_fma(auVar40,local_220,auVar93);
  local_760._0_4_ = auVar27._0_4_;
  local_760._4_4_ = auVar27._4_4_;
  uStack_758._0_4_ = auVar27._8_4_;
  uStack_758._4_4_ = auVar27._12_4_;
  uStack_750._0_4_ = auVar27._16_4_;
  uStack_750._4_4_ = auVar27._20_4_;
  uStack_748._0_4_ = auVar27._24_4_;
  uStack_748._4_4_ = auVar27._28_4_;
  auVar41._4_4_ = (float)local_760._4_4_ * fVar236;
  auVar41._0_4_ = (float)local_760._0_4_ * fVar220;
  auVar41._8_4_ = (float)uStack_758 * fVar237;
  auVar41._12_4_ = uStack_758._4_4_ * fVar238;
  auVar41._16_4_ = (float)uStack_750 * fVar239;
  auVar41._20_4_ = uStack_750._4_4_ * fVar240;
  auVar41._24_4_ = (float)uStack_748 * fVar241;
  auVar41._28_4_ = uStack_748._4_4_;
  auVar108 = vfnmadd231ps_fma(auVar41,auVar26,auVar93);
  auVar254._0_4_ = fVar145 * fVar220;
  auVar254._4_4_ = fVar128 * fVar236;
  auVar254._8_4_ = fVar142 * fVar237;
  auVar254._12_4_ = fVar143 * fVar238;
  auVar254._16_4_ = fVar239 * 0.0;
  auVar254._20_4_ = fVar240 * 0.0;
  auVar254._24_4_ = fVar241 * 0.0;
  auVar254._28_4_ = 0;
  auVar147 = vfnmadd231ps_fma(auVar254,auVar294,auVar93);
  uStack_284 = 0x40400000;
  auVar42._4_4_ = fStack_29c * fVar236;
  auVar42._0_4_ = local_2a0 * fVar220;
  auVar42._8_4_ = fStack_298 * fVar237;
  auVar42._12_4_ = fStack_294 * fVar238;
  auVar42._16_4_ = fStack_290 * fVar239;
  auVar42._20_4_ = fStack_28c * fVar240;
  auVar42._24_4_ = fStack_288 * fVar241;
  auVar42._28_4_ = auVar26._28_4_;
  auVar192 = vfnmadd231ps_fma(auVar42,local_260,auVar93);
  auVar43._4_4_ = local_280._4_4_ * fVar236;
  auVar43._0_4_ = local_280._0_4_ * fVar220;
  auVar43._8_4_ = local_280._8_4_ * fVar237;
  auVar43._12_4_ = local_280._12_4_ * fVar238;
  auVar43._16_4_ = local_280._16_4_ * fVar239;
  auVar43._20_4_ = local_280._20_4_ * fVar240;
  auVar43._24_4_ = local_280._24_4_ * fVar241;
  auVar43._28_4_ = local_280._28_4_;
  auVar201 = vfnmadd231ps_fma(auVar43,auVar30,auVar93);
  auVar44._4_4_ = auVar29._4_4_ * fVar236;
  auVar44._0_4_ = auVar29._0_4_ * fVar220;
  auVar44._8_4_ = auVar29._8_4_ * fVar237;
  auVar44._12_4_ = auVar29._12_4_ * fVar238;
  auVar44._16_4_ = auVar29._16_4_ * fVar239;
  auVar44._20_4_ = auVar29._20_4_ * fVar240;
  auVar44._24_4_ = auVar29._24_4_ * fVar241;
  auVar44._28_4_ = auVar91._28_4_ + auVar92._28_4_;
  auVar281 = vfnmadd231ps_fma(auVar44,auVar28,auVar93);
  auVar25 = vminps_avx(ZEXT1632(auVar18),ZEXT1632(auVar19));
  auVar91 = vmaxps_avx(ZEXT1632(auVar18),ZEXT1632(auVar19));
  auVar92 = vminps_avx(ZEXT1632(auVar102),ZEXT1632(auVar108));
  auVar92 = vminps_avx(auVar25,auVar92);
  auVar25 = vmaxps_avx(ZEXT1632(auVar102),ZEXT1632(auVar108));
  auVar91 = vmaxps_avx(auVar91,auVar25);
  auVar24 = vminps_avx(ZEXT1632(auVar147),ZEXT1632(auVar192));
  auVar25 = vmaxps_avx(ZEXT1632(auVar147),ZEXT1632(auVar192));
  auVar16 = vminps_avx(ZEXT1632(auVar201),ZEXT1632(auVar281));
  auVar24 = vminps_avx(auVar24,auVar16);
  auVar24 = vminps_avx(auVar92,auVar24);
  auVar92 = vmaxps_avx(ZEXT1632(auVar201),ZEXT1632(auVar281));
  auVar25 = vmaxps_avx(auVar25,auVar92);
  auVar25 = vmaxps_avx(auVar91,auVar25);
  auVar53._4_4_ = fStack_1bc;
  auVar53._0_4_ = local_1c0;
  auVar53._8_4_ = fStack_1b8;
  auVar53._12_4_ = fStack_1b4;
  auVar53._16_4_ = fStack_1b0;
  auVar53._20_4_ = fStack_1ac;
  auVar53._24_4_ = fStack_1a8;
  auVar53._28_4_ = fStack_1a4;
  auVar91 = vcmpps_avx(auVar24,auVar53,2);
  auVar52._4_4_ = fStack_1dc;
  auVar52._0_4_ = local_1e0;
  auVar52._8_4_ = fStack_1d8;
  auVar52._12_4_ = fStack_1d4;
  auVar52._16_4_ = fStack_1d0;
  auVar52._20_4_ = fStack_1cc;
  auVar52._24_4_ = fStack_1c8;
  auVar52._28_4_ = fStack_1c4;
  auVar25 = vcmpps_avx(auVar25,auVar52,5);
  auVar91 = vandps_avx(auVar25,auVar91);
  auVar25 = local_300 & auVar91;
  if ((((((((auVar25 >> 0x1f & (undefined1  [32])0x1) != (undefined1  [32])0x0 ||
           (auVar25 >> 0x3f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
          (auVar25 >> 0x5f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
         SUB321(auVar25 >> 0x7f,0) != '\0') ||
        (auVar25 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
       SUB321(auVar25 >> 0xbf,0) != '\0') ||
      (auVar25 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) || auVar25[0x1f] < '\0') {
    auVar25 = vsubps_avx(auVar26,local_200);
    auVar92 = vsubps_avx(auVar28,auVar294);
    fVar236 = auVar25._0_4_ + auVar92._0_4_;
    fVar237 = auVar25._4_4_ + auVar92._4_4_;
    fVar238 = auVar25._8_4_ + auVar92._8_4_;
    fVar239 = auVar25._12_4_ + auVar92._12_4_;
    fVar240 = auVar25._16_4_ + auVar92._16_4_;
    fVar241 = auVar25._20_4_ + auVar92._20_4_;
    fVar97 = auVar25._24_4_ + auVar92._24_4_;
    auVar24 = vsubps_avx(auVar27,local_240);
    auVar16 = vsubps_avx(auVar29,ZEXT1632(auVar286));
    auVar126._0_4_ = auVar24._0_4_ + auVar16._0_4_;
    auVar126._4_4_ = auVar24._4_4_ + auVar16._4_4_;
    auVar126._8_4_ = auVar24._8_4_ + auVar16._8_4_;
    auVar126._12_4_ = auVar24._12_4_ + auVar16._12_4_;
    auVar126._16_4_ = auVar24._16_4_ + auVar16._16_4_;
    auVar126._20_4_ = auVar24._20_4_ + auVar16._20_4_;
    auVar126._24_4_ = auVar24._24_4_ + auVar16._24_4_;
    fVar220 = auVar16._28_4_;
    auVar126._28_4_ = auVar24._28_4_ + fVar220;
    auVar45._4_4_ = fVar95 * fVar237;
    auVar45._0_4_ = fVar98 * fVar236;
    auVar45._8_4_ = fVar146 * fVar238;
    auVar45._12_4_ = fVar96 * fVar239;
    auVar45._16_4_ = fVar240 * 0.0;
    auVar45._20_4_ = fVar241 * 0.0;
    auVar45._24_4_ = fVar97 * 0.0;
    auVar45._28_4_ = auVar29._28_4_;
    auVar147 = vfnmadd231ps_fma(auVar45,auVar126,local_200);
    auVar46._4_4_ = fVar237 * fStack_2bc;
    auVar46._0_4_ = fVar236 * local_2c0;
    auVar46._8_4_ = fVar238 * fStack_2b8;
    auVar46._12_4_ = fVar239 * fStack_2b4;
    auVar46._16_4_ = fVar240 * fStack_2b0;
    auVar46._20_4_ = fVar241 * fStack_2ac;
    auVar46._24_4_ = fVar97 * fStack_2a8;
    auVar46._28_4_ = 0;
    auVar18 = vfnmadd213ps_fma(auVar125,auVar126,auVar46);
    auVar47._4_4_ = fVar237 * local_2e0._4_4_;
    auVar47._0_4_ = fVar236 * local_2e0._0_4_;
    auVar47._8_4_ = fVar238 * local_2e0._8_4_;
    auVar47._12_4_ = fVar239 * local_2e0._12_4_;
    auVar47._16_4_ = fVar240 * local_2e0._16_4_;
    auVar47._20_4_ = fVar241 * local_2e0._20_4_;
    auVar47._24_4_ = fVar97 * local_2e0._24_4_;
    auVar47._28_4_ = 0;
    auVar19 = vfnmadd213ps_fma(local_220,auVar126,auVar47);
    auVar48._4_4_ = (float)local_760._4_4_ * fVar237;
    auVar48._0_4_ = (float)local_760._0_4_ * fVar236;
    auVar48._8_4_ = (float)uStack_758 * fVar238;
    auVar48._12_4_ = uStack_758._4_4_ * fVar239;
    auVar48._16_4_ = (float)uStack_750 * fVar240;
    auVar48._20_4_ = uStack_750._4_4_ * fVar241;
    auVar48._24_4_ = (float)uStack_748 * fVar97;
    auVar48._28_4_ = 0;
    auVar286 = vfnmadd231ps_fma(auVar48,auVar126,auVar26);
    auVar161._0_4_ = fVar145 * fVar236;
    auVar161._4_4_ = fVar128 * fVar237;
    auVar161._8_4_ = fVar142 * fVar238;
    auVar161._12_4_ = fVar143 * fVar239;
    auVar161._16_4_ = fVar240 * 0.0;
    auVar161._20_4_ = fVar241 * 0.0;
    auVar161._24_4_ = fVar97 * 0.0;
    auVar161._28_4_ = 0;
    auVar192 = vfnmadd231ps_fma(auVar161,auVar126,auVar294);
    auVar49._4_4_ = fVar237 * fStack_29c;
    auVar49._0_4_ = fVar236 * local_2a0;
    auVar49._8_4_ = fVar238 * fStack_298;
    auVar49._12_4_ = fVar239 * fStack_294;
    auVar49._16_4_ = fVar240 * fStack_290;
    auVar49._20_4_ = fVar241 * fStack_28c;
    auVar49._24_4_ = fVar97 * fStack_288;
    auVar49._28_4_ = fVar220;
    auVar102 = vfnmadd213ps_fma(local_260,auVar126,auVar49);
    auVar50._4_4_ = fVar237 * local_280._4_4_;
    auVar50._0_4_ = fVar236 * local_280._0_4_;
    auVar50._8_4_ = fVar238 * local_280._8_4_;
    auVar50._12_4_ = fVar239 * local_280._12_4_;
    auVar50._16_4_ = fVar240 * local_280._16_4_;
    auVar50._20_4_ = fVar241 * local_280._20_4_;
    auVar50._24_4_ = fVar97 * local_280._24_4_;
    auVar50._28_4_ = fVar220;
    auVar108 = vfnmadd213ps_fma(auVar30,auVar126,auVar50);
    auVar51._4_4_ = fVar237 * auVar29._4_4_;
    auVar51._0_4_ = fVar236 * auVar29._0_4_;
    auVar51._8_4_ = fVar238 * auVar29._8_4_;
    auVar51._12_4_ = fVar239 * auVar29._12_4_;
    auVar51._16_4_ = fVar240 * auVar29._16_4_;
    auVar51._20_4_ = fVar241 * auVar29._20_4_;
    auVar51._24_4_ = fVar97 * auVar29._24_4_;
    auVar51._28_4_ = auVar25._28_4_ + auVar92._28_4_;
    auVar201 = vfnmadd231ps_fma(auVar51,auVar126,auVar28);
    auVar92 = vminps_avx(ZEXT1632(auVar147),ZEXT1632(auVar18));
    auVar25 = vmaxps_avx(ZEXT1632(auVar147),ZEXT1632(auVar18));
    auVar24 = vminps_avx(ZEXT1632(auVar19),ZEXT1632(auVar286));
    auVar24 = vminps_avx(auVar92,auVar24);
    auVar92 = vmaxps_avx(ZEXT1632(auVar19),ZEXT1632(auVar286));
    auVar25 = vmaxps_avx(auVar25,auVar92);
    auVar16 = vminps_avx(ZEXT1632(auVar192),ZEXT1632(auVar102));
    auVar92 = vmaxps_avx(ZEXT1632(auVar192),ZEXT1632(auVar102));
    auVar26 = vminps_avx(ZEXT1632(auVar108),ZEXT1632(auVar201));
    auVar16 = vminps_avx(auVar16,auVar26);
    auVar16 = vminps_avx(auVar24,auVar16);
    auVar24 = vmaxps_avx(ZEXT1632(auVar108),ZEXT1632(auVar201));
    auVar92 = vmaxps_avx(auVar92,auVar24);
    auVar92 = vmaxps_avx(auVar25,auVar92);
    auVar25 = vcmpps_avx(auVar16,auVar53,2);
    auVar92 = vcmpps_avx(auVar92,auVar52,5);
    auVar25 = vandps_avx(auVar92,auVar25);
    auVar91 = vandps_avx(auVar91,local_300);
    auVar92 = auVar91 & auVar25;
    if ((((((((auVar92 >> 0x1f & (undefined1  [32])0x1) != (undefined1  [32])0x0 ||
             (auVar92 >> 0x3f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
            (auVar92 >> 0x5f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
           SUB321(auVar92 >> 0x7f,0) != '\0') ||
          (auVar92 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
         SUB321(auVar92 >> 0xbf,0) != '\0') ||
        (auVar92 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) || auVar92[0x1f] < '\0')
    {
      auVar91 = vandps_avx(auVar25,auVar91);
      uVar64 = vmovmskps_avx(auVar91);
      if (uVar64 != 0) {
        auStack_4e0[uVar62] = uVar64 & 0xff;
        uVar99 = vmovlps_avx(local_430);
        *(undefined8 *)(&uStack_380 + uVar62 * 2) = uVar99;
        uVar63 = vmovlps_avx(auVar78);
        auStack_1a0[uVar62] = uVar63;
        uVar62 = (ulong)((int)uVar62 + 1);
      }
    }
  }
LAB_01241f4f:
  if ((int)uVar62 != 0) {
    uVar56 = (int)uVar62 - 1;
    uVar59 = (ulong)uVar56;
    uVar61 = auStack_4e0[uVar59];
    uVar64 = (&uStack_380)[uVar59 * 2];
    fVar98 = afStack_37c[uVar59 * 2];
    iVar55 = 0;
    for (uVar63 = (ulong)uVar61; (uVar63 & 1) == 0; uVar63 = uVar63 >> 1 | 0x8000000000000000) {
      iVar55 = iVar55 + 1;
    }
    uVar61 = uVar61 - 1 & uVar61;
    if (uVar61 == 0) {
      uVar62 = (ulong)uVar56;
    }
    auVar78._8_8_ = 0;
    auVar78._0_8_ = auStack_1a0[uVar59];
    auStack_4e0[uVar59] = uVar61;
    fVar95 = (float)(iVar55 + 1) * 0.14285715;
    auVar18 = vfmadd231ss_fma(ZEXT416((uint)(fVar98 * (float)iVar55 * 0.14285715)),ZEXT416(uVar64),
                              ZEXT416((uint)(1.0 - (float)iVar55 * 0.14285715)));
    auVar19 = vfmadd231ss_fma(ZEXT416((uint)(fVar98 * fVar95)),ZEXT416(uVar64),
                              ZEXT416((uint)(1.0 - fVar95)));
    fVar95 = auVar19._0_4_;
    auVar234._0_4_ = auVar18._0_4_;
    fVar98 = fVar95 - auVar234._0_4_;
    if (fVar98 < 0.16666667) {
      auVar102 = vshufps_avx(auVar78,auVar78,0x50);
      auVar114._8_4_ = 0x3f800000;
      auVar114._0_8_ = 0x3f8000003f800000;
      auVar114._12_4_ = 0x3f800000;
      auVar108 = vsubps_avx(auVar114,auVar102);
      fVar146 = auVar102._0_4_;
      auVar174._0_4_ = fVar146 * fVar144;
      fVar96 = auVar102._4_4_;
      auVar174._4_4_ = fVar96 * fVar163;
      fVar145 = auVar102._8_4_;
      auVar174._8_4_ = fVar145 * fVar144;
      fVar128 = auVar102._12_4_;
      auVar174._12_4_ = fVar128 * fVar163;
      auVar190._0_4_ = fVar146 * fVar181;
      auVar190._4_4_ = fVar96 * fVar218;
      auVar190._8_4_ = fVar145 * fVar181;
      auVar190._12_4_ = fVar128 * fVar218;
      auVar214._0_4_ = fVar146 * fVar219;
      auVar214._4_4_ = fVar96 * fVar235;
      auVar214._8_4_ = fVar145 * fVar219;
      auVar214._12_4_ = fVar128 * fVar235;
      auVar80._0_4_ = fVar146 * fVar179;
      auVar80._4_4_ = fVar96 * fVar180;
      auVar80._8_4_ = fVar145 * fVar179;
      auVar80._12_4_ = fVar128 * fVar180;
      auVar102 = vfmadd231ps_fma(auVar174,auVar108,auVar247);
      auVar147 = vfmadd231ps_fma(auVar190,auVar108,auVar267);
      auVar286 = vfmadd231ps_fma(auVar214,auVar108,auVar303);
      auVar108 = vfmadd231ps_fma(auVar80,auVar108,auVar317);
      auVar162._16_16_ = auVar102;
      auVar162._0_16_ = auVar102;
      auVar178._16_16_ = auVar147;
      auVar178._0_16_ = auVar147;
      auVar200._16_16_ = auVar286;
      auVar200._0_16_ = auVar286;
      auVar234._4_4_ = auVar234._0_4_;
      auVar234._8_4_ = auVar234._0_4_;
      auVar234._12_4_ = auVar234._0_4_;
      auVar234._20_4_ = fVar95;
      auVar234._16_4_ = fVar95;
      auVar234._24_4_ = fVar95;
      auVar234._28_4_ = fVar95;
      auVar91 = vsubps_avx(auVar178,auVar162);
      auVar147 = vfmadd213ps_fma(auVar91,auVar234,auVar162);
      auVar91 = vsubps_avx(auVar200,auVar178);
      auVar192 = vfmadd213ps_fma(auVar91,auVar234,auVar178);
      auVar102 = vsubps_avx(auVar108,auVar286);
      auVar94._16_16_ = auVar102;
      auVar94._0_16_ = auVar102;
      auVar102 = vfmadd213ps_fma(auVar94,auVar234,auVar200);
      auVar91 = vsubps_avx(ZEXT1632(auVar192),ZEXT1632(auVar147));
      auVar108 = vfmadd213ps_fma(auVar91,auVar234,ZEXT1632(auVar147));
      auVar91 = vsubps_avx(ZEXT1632(auVar102),ZEXT1632(auVar192));
      auVar102 = vfmadd213ps_fma(auVar91,auVar234,ZEXT1632(auVar192));
      auVar91 = vsubps_avx(ZEXT1632(auVar102),ZEXT1632(auVar108));
      auVar242 = vfmadd231ps_fma(ZEXT1632(auVar108),auVar91,auVar234);
      fVar146 = fVar98 * 0.33333334;
      auVar228._0_8_ =
           CONCAT44(auVar242._4_4_ + fVar146 * auVar91._4_4_ * 3.0,
                    auVar242._0_4_ + fVar146 * auVar91._0_4_ * 3.0);
      auVar228._8_4_ = auVar242._8_4_ + fVar146 * auVar91._8_4_ * 3.0;
      auVar228._12_4_ = auVar242._12_4_ + fVar146 * auVar91._12_4_ * 3.0;
      auVar108 = vshufpd_avx(auVar242,auVar242,3);
      auVar147 = vshufpd_avx((undefined1  [16])0x0,(undefined1  [16])0x0,3);
      auVar102 = vsubps_avx(auVar108,auVar242);
      auVar286 = vsubps_avx(auVar147,(undefined1  [16])0x0);
      auVar81._0_4_ = auVar102._0_4_ + auVar286._0_4_;
      auVar81._4_4_ = auVar102._4_4_ + auVar286._4_4_;
      auVar81._8_4_ = auVar102._8_4_ + auVar286._8_4_;
      auVar81._12_4_ = auVar102._12_4_ + auVar286._12_4_;
      auVar102 = vshufps_avx(auVar242,auVar242,0xb1);
      auVar286 = vshufps_avx(auVar228,auVar228,0xb1);
      auVar318._4_4_ = auVar81._0_4_;
      auVar318._0_4_ = auVar81._0_4_;
      auVar318._8_4_ = auVar81._0_4_;
      auVar318._12_4_ = auVar81._0_4_;
      auVar192 = vshufps_avx(auVar81,auVar81,0x55);
      fVar96 = auVar192._0_4_;
      auVar82._0_4_ = fVar96 * auVar102._0_4_;
      fVar145 = auVar192._4_4_;
      auVar82._4_4_ = fVar145 * auVar102._4_4_;
      fVar128 = auVar192._8_4_;
      auVar82._8_4_ = fVar128 * auVar102._8_4_;
      fVar142 = auVar192._12_4_;
      auVar82._12_4_ = fVar142 * auVar102._12_4_;
      auVar191._0_4_ = fVar96 * auVar286._0_4_;
      auVar191._4_4_ = fVar145 * auVar286._4_4_;
      auVar191._8_4_ = fVar128 * auVar286._8_4_;
      auVar191._12_4_ = fVar142 * auVar286._12_4_;
      auVar201 = vfmadd231ps_fma(auVar82,auVar318,auVar242);
      auVar281 = vfmadd231ps_fma(auVar191,auVar318,auVar228);
      auVar286 = vshufps_avx(auVar201,auVar201,0xe8);
      auVar192 = vshufps_avx(auVar281,auVar281,0xe8);
      auVar102 = vcmpps_avx(auVar286,auVar192,1);
      uVar64 = vextractps_avx(auVar102,0);
      auVar243 = auVar281;
      if ((uVar64 & 1) == 0) {
        auVar243 = auVar201;
      }
      auVar153._0_4_ = fVar146 * auVar91._16_4_ * 3.0;
      auVar153._4_4_ = fVar146 * auVar91._20_4_ * 3.0;
      auVar153._8_4_ = fVar146 * auVar91._24_4_ * 3.0;
      auVar153._12_4_ = fVar146 * 0.0;
      auVar314 = vsubps_avx((undefined1  [16])0x0,auVar153);
      auVar154 = vshufps_avx(auVar314,auVar314,0xb1);
      auVar255 = vshufps_avx((undefined1  [16])0x0,(undefined1  [16])0x0,0xb1);
      auVar229._0_4_ = fVar96 * auVar154._0_4_;
      auVar229._4_4_ = fVar145 * auVar154._4_4_;
      auVar229._8_4_ = fVar128 * auVar154._8_4_;
      auVar229._12_4_ = fVar142 * auVar154._12_4_;
      auVar248._0_4_ = auVar255._0_4_ * fVar96;
      auVar248._4_4_ = auVar255._4_4_ * fVar145;
      auVar248._8_4_ = auVar255._8_4_ * fVar128;
      auVar248._12_4_ = auVar255._12_4_ * fVar142;
      auVar323 = vfmadd231ps_fma(auVar229,auVar318,auVar314);
      auVar324 = vfmadd231ps_fma(auVar248,(undefined1  [16])0x0,auVar318);
      auVar255 = vshufps_avx(auVar323,auVar323,0xe8);
      auVar296 = vshufps_avx(auVar324,auVar324,0xe8);
      auVar154 = vcmpps_avx(auVar255,auVar296,1);
      uVar64 = vextractps_avx(auVar154,0);
      auVar268 = auVar324;
      if ((uVar64 & 1) == 0) {
        auVar268 = auVar323;
      }
      auVar243 = vmaxss_avx(auVar268,auVar243);
      auVar286 = vminps_avx(auVar286,auVar192);
      auVar192 = vminps_avx(auVar255,auVar296);
      auVar192 = vminps_avx(auVar286,auVar192);
      auVar102 = vshufps_avx(auVar102,auVar102,0x55);
      auVar102 = vblendps_avx(auVar102,auVar154,2);
      auVar154 = vpslld_avx(auVar102,0x1f);
      auVar102 = vshufpd_avx(auVar281,auVar281,1);
      auVar102 = vinsertps_avx(auVar102,auVar324,0x9c);
      auVar286 = vshufpd_avx(auVar201,auVar201,1);
      auVar286 = vinsertps_avx(auVar286,auVar323,0x9c);
      auVar102 = vblendvps_avx(auVar286,auVar102,auVar154);
      auVar286 = vmovshdup_avx(auVar102);
      auVar102 = vmaxss_avx(auVar286,auVar102);
      fVar128 = auVar192._0_4_;
      auVar286 = vmovshdup_avx(auVar192);
      fVar145 = auVar102._0_4_;
      fVar146 = auVar286._0_4_;
      fVar96 = auVar243._0_4_;
      if (((0.0001 <= fVar128) || (fVar145 <= -0.0001)) && (0.0001 <= fVar146 || fVar145 <= -0.0001)
         ) goto code_r0x01242257;
      goto LAB_0124227d;
    }
    local_430 = vinsertps_avx(auVar18,auVar19,0x10);
    goto LAB_0124199e;
  }
  if (bVar68) goto LAB_01242e1f;
  uVar67 = *(undefined4 *)(ray + k * 4 + 0x100);
  auVar90._4_4_ = uVar67;
  auVar90._0_4_ = uVar67;
  auVar90._8_4_ = uVar67;
  auVar90._12_4_ = uVar67;
  auVar15 = vcmpps_avx(local_440,auVar90,2);
  uVar57 = vmovmskps_avx(auVar15);
  uVar58 = (ulong)((uint)uVar58 & (uint)uVar58 + 0xf & uVar57);
  goto LAB_01240cad;
code_r0x01242257:
  auVar286 = vcmpps_avx(auVar286,SUB6416(ZEXT464(0x38d1b717),0),5);
  auVar201 = vcmpps_avx(auVar192,SUB6416(ZEXT464(0x38d1b717),0),5);
  auVar286 = vandps_avx(auVar201,auVar286);
  if (fVar96 <= -0.0001 || (auVar286 & (undefined1  [16])0x1) != (undefined1  [16])0x0)
  goto LAB_01241f4f;
LAB_0124227d:
  auVar201 = vcmpps_avx(auVar192,_DAT_01f45a50,1);
  auVar281 = SUB6416(ZEXT864(0),0) << 0x20;
  auVar286 = vcmpss_avx(auVar243,ZEXT816(0) << 0x20,1);
  auVar115._8_4_ = 0x3f800000;
  auVar115._0_8_ = 0x3f8000003f800000;
  auVar115._12_4_ = 0x3f800000;
  auVar136._8_4_ = 0xbf800000;
  auVar136._0_8_ = 0xbf800000bf800000;
  auVar136._12_4_ = 0xbf800000;
  auVar286 = vblendvps_avx(auVar115,auVar136,auVar286);
  auVar201 = vblendvps_avx(auVar115,auVar136,auVar201);
  fVar143 = auVar201._0_4_;
  fVar142 = auVar286._0_4_;
  auVar286 = SUB6416(ZEXT864(0),0) << 0x20;
  if ((fVar143 == fVar142) && (!NAN(fVar143) && !NAN(fVar142))) {
    auVar286 = SUB6416(ZEXT464(0x7f800000),0);
  }
  if ((fVar143 == fVar142) && (!NAN(fVar143) && !NAN(fVar142))) {
    auVar281 = SUB6416(ZEXT464(0xff800000),0);
  }
  auVar201 = vmovshdup_avx(auVar201);
  fVar220 = auVar201._0_4_;
  if ((fVar143 != fVar220) || (NAN(fVar143) || NAN(fVar220))) {
    if ((fVar146 != fVar128) || (NAN(fVar146) || NAN(fVar128))) {
      auVar155._0_8_ = auVar192._0_8_ ^ 0x8000000080000000;
      auVar155._8_4_ = auVar192._8_4_ ^ 0x80000000;
      auVar155._12_4_ = auVar192._12_4_ ^ 0x80000000;
      auVar156._0_4_ = -fVar128 / (fVar146 - fVar128);
      auVar156._4_12_ = auVar155._4_12_;
      auVar192 = vfmadd132ss_fma(ZEXT416((uint)(1.0 - auVar156._0_4_)),auVar156,ZEXT416(0));
      auVar201 = auVar192;
    }
    else {
      auVar192 = ZEXT816(0) << 0x20;
      if ((fVar128 != 0.0) || (auVar201 = SUB6416(ZEXT464(0x3f800000),0), NAN(fVar128))) {
        auVar192 = SUB6416(ZEXT464(0x7f800000),0);
        auVar201 = SUB6416(ZEXT464(0xff800000),0);
      }
    }
    auVar286 = vminss_avx(auVar286,auVar192);
    auVar281 = vmaxss_avx(auVar201,auVar281);
  }
  auVar102 = vcmpss_avx(auVar102,ZEXT416(0),1);
  auVar116._8_4_ = 0x3f800000;
  auVar116._0_8_ = 0x3f8000003f800000;
  auVar116._12_4_ = 0x3f800000;
  auVar137._8_4_ = 0xbf800000;
  auVar137._0_8_ = 0xbf800000bf800000;
  auVar137._12_4_ = 0xbf800000;
  auVar102 = vblendvps_avx(auVar116,auVar137,auVar102);
  fVar146 = auVar102._0_4_;
  if ((fVar142 != fVar146) || (NAN(fVar142) || NAN(fVar146))) {
    if ((fVar145 != fVar96) || (NAN(fVar145) || NAN(fVar96))) {
      auVar83._0_8_ = auVar243._0_8_ ^ 0x8000000080000000;
      auVar83._8_4_ = auVar243._8_4_ ^ 0x80000000;
      auVar83._12_4_ = auVar243._12_4_ ^ 0x80000000;
      auVar157._0_4_ = -fVar96 / (fVar145 - fVar96);
      auVar157._4_12_ = auVar83._4_12_;
      auVar102 = vfmadd132ss_fma(ZEXT416((uint)(1.0 - auVar157._0_4_)),auVar157,ZEXT416(0));
      auVar192 = auVar102;
    }
    else {
      auVar102 = SUB6416(ZEXT464(0x3f800000),0);
      if ((fVar96 != 0.0) || (auVar192 = SUB6416(ZEXT864(0),0) << 0x20, NAN(fVar96))) {
        auVar102 = SUB6416(ZEXT464(0xff800000),0);
        auVar192 = SUB6416(ZEXT464(0x7f800000),0);
      }
    }
    auVar286 = vminss_avx(auVar286,auVar192);
    auVar281 = vmaxss_avx(auVar102,auVar281);
  }
  if ((fVar220 != fVar146) || (NAN(fVar220) || NAN(fVar146))) {
    auVar286 = vminss_avx(auVar286,SUB6416(ZEXT464(0x3f800000),0));
    auVar281 = vmaxss_avx(SUB6416(ZEXT464(0x3f800000),0),auVar281);
  }
  auVar102 = vmaxss_avx(ZEXT816(0) << 0x40,auVar286);
  auVar286 = vminss_avx(auVar281,SUB6416(ZEXT464(0x3f800000),0));
  if (auVar286._0_4_ < auVar102._0_4_) goto LAB_01241f4f;
  auVar102 = vmaxss_avx(ZEXT816(0),ZEXT416((uint)(auVar102._0_4_ + -0.1)));
  auVar286 = vminss_avx(ZEXT416((uint)(auVar286._0_4_ + 0.1)),SUB6416(ZEXT464(0x3f800000),0));
  auVar175._0_8_ = auVar242._0_8_;
  auVar175._8_8_ = auVar175._0_8_;
  auVar258._8_8_ = auVar228._0_8_;
  auVar258._0_8_ = auVar228._0_8_;
  auVar269._8_8_ = auVar314._0_8_;
  auVar269._0_8_ = auVar314._0_8_;
  auVar192 = vshufpd_avx(auVar228,auVar228,3);
  auVar201 = vshufpd_avx(auVar314,auVar314,3);
  auVar281 = vshufps_avx(auVar102,auVar286,0);
  auVar84._8_4_ = 0x3f800000;
  auVar84._0_8_ = 0x3f8000003f800000;
  auVar84._12_4_ = 0x3f800000;
  auVar242 = vsubps_avx(auVar84,auVar281);
  local_5e0 = auVar108._0_4_;
  fStack_5dc = auVar108._4_4_;
  fStack_5d8 = auVar108._8_4_;
  fStack_5d4 = auVar108._12_4_;
  fVar146 = auVar281._0_4_;
  auVar85._0_4_ = fVar146 * local_5e0;
  fVar96 = auVar281._4_4_;
  auVar85._4_4_ = fVar96 * fStack_5dc;
  fVar145 = auVar281._8_4_;
  auVar85._8_4_ = fVar145 * fStack_5d8;
  fVar128 = auVar281._12_4_;
  auVar85._12_4_ = fVar128 * fStack_5d4;
  auVar215._0_4_ = fVar146 * auVar192._0_4_;
  auVar215._4_4_ = fVar96 * auVar192._4_4_;
  auVar215._8_4_ = fVar145 * auVar192._8_4_;
  auVar215._12_4_ = fVar128 * auVar192._12_4_;
  auVar230._0_4_ = fVar146 * auVar201._0_4_;
  auVar230._4_4_ = fVar96 * auVar201._4_4_;
  auVar230._8_4_ = fVar145 * auVar201._8_4_;
  auVar230._12_4_ = fVar128 * auVar201._12_4_;
  local_640 = auVar147._0_4_;
  fStack_63c = auVar147._4_4_;
  fStack_638 = auVar147._8_4_;
  fStack_634 = auVar147._12_4_;
  auVar249._0_4_ = fVar146 * local_640;
  auVar249._4_4_ = fVar96 * fStack_63c;
  auVar249._8_4_ = fVar145 * fStack_638;
  auVar249._12_4_ = fVar128 * fStack_634;
  auVar192 = vfmadd231ps_fma(auVar85,auVar242,auVar175);
  auVar201 = vfmadd231ps_fma(auVar215,auVar242,auVar258);
  auVar281 = vfmadd231ps_fma(auVar230,auVar242,auVar269);
  auVar242 = vfmadd231ps_fma(auVar249,auVar242,ZEXT816(0));
  auVar108 = vmovshdup_avx(auVar78);
  auVar314 = vfmadd231ss_fma(ZEXT416((uint)(auVar108._0_4_ * auVar102._0_4_)),auVar78,
                             ZEXT416((uint)(1.0 - auVar102._0_4_)));
  auVar323 = vfmadd231ss_fma(ZEXT416((uint)(auVar108._0_4_ * auVar286._0_4_)),auVar78,
                             ZEXT416((uint)(1.0 - auVar286._0_4_)));
  fVar146 = 1.0 / fVar98;
  auVar102 = vsubps_avx(auVar201,auVar192);
  auVar259._0_4_ = auVar102._0_4_ * 3.0;
  auVar259._4_4_ = auVar102._4_4_ * 3.0;
  auVar259._8_4_ = auVar102._8_4_ * 3.0;
  auVar259._12_4_ = auVar102._12_4_ * 3.0;
  auVar102 = vsubps_avx(auVar281,auVar201);
  auVar270._0_4_ = auVar102._0_4_ * 3.0;
  auVar270._4_4_ = auVar102._4_4_ * 3.0;
  auVar270._8_4_ = auVar102._8_4_ * 3.0;
  auVar270._12_4_ = auVar102._12_4_ * 3.0;
  auVar102 = vsubps_avx(auVar242,auVar281);
  auVar282._0_4_ = auVar102._0_4_ * 3.0;
  auVar282._4_4_ = auVar102._4_4_ * 3.0;
  auVar282._8_4_ = auVar102._8_4_ * 3.0;
  auVar282._12_4_ = auVar102._12_4_ * 3.0;
  auVar108 = vminps_avx(auVar270,auVar282);
  auVar102 = vmaxps_avx(auVar270,auVar282);
  auVar108 = vminps_avx(auVar259,auVar108);
  auVar102 = vmaxps_avx(auVar259,auVar102);
  auVar147 = vshufpd_avx(auVar108,auVar108,3);
  auVar286 = vshufpd_avx(auVar102,auVar102,3);
  auVar108 = vminps_avx(auVar108,auVar147);
  auVar102 = vmaxps_avx(auVar102,auVar286);
  auVar271._0_4_ = auVar108._0_4_ * fVar146;
  auVar271._4_4_ = auVar108._4_4_ * fVar146;
  auVar271._8_4_ = auVar108._8_4_ * fVar146;
  auVar271._12_4_ = auVar108._12_4_ * fVar146;
  auVar260._0_4_ = auVar102._0_4_ * fVar146;
  auVar260._4_4_ = auVar102._4_4_ * fVar146;
  auVar260._8_4_ = auVar102._8_4_ * fVar146;
  auVar260._12_4_ = auVar102._12_4_ * fVar146;
  fVar146 = 1.0 / (auVar323._0_4_ - auVar314._0_4_);
  auVar102 = vshufpd_avx(auVar192,auVar192,3);
  auVar108 = vshufpd_avx(auVar201,auVar201,3);
  auVar147 = vshufpd_avx(auVar281,auVar281,3);
  auVar286 = vshufpd_avx(auVar242,auVar242,3);
  auVar102 = vsubps_avx(auVar102,auVar192);
  auVar192 = vsubps_avx(auVar108,auVar201);
  auVar201 = vsubps_avx(auVar147,auVar281);
  auVar286 = vsubps_avx(auVar286,auVar242);
  auVar108 = vminps_avx(auVar102,auVar192);
  auVar102 = vmaxps_avx(auVar102,auVar192);
  auVar147 = vminps_avx(auVar201,auVar286);
  auVar147 = vminps_avx(auVar108,auVar147);
  auVar108 = vmaxps_avx(auVar201,auVar286);
  auVar102 = vmaxps_avx(auVar102,auVar108);
  auVar304._0_4_ = fVar146 * auVar147._0_4_;
  auVar304._4_4_ = fVar146 * auVar147._4_4_;
  auVar304._8_4_ = fVar146 * auVar147._8_4_;
  auVar304._12_4_ = fVar146 * auVar147._12_4_;
  auVar287._0_4_ = fVar146 * auVar102._0_4_;
  auVar287._4_4_ = fVar146 * auVar102._4_4_;
  auVar287._8_4_ = fVar146 * auVar102._8_4_;
  auVar287._12_4_ = fVar146 * auVar102._12_4_;
  auVar286 = vinsertps_avx(auVar18,auVar314,0x10);
  auVar192 = vinsertps_avx(auVar19,auVar323,0x10);
  auVar283._0_4_ = (auVar286._0_4_ + auVar192._0_4_) * 0.5;
  auVar283._4_4_ = (auVar286._4_4_ + auVar192._4_4_) * 0.5;
  auVar283._8_4_ = (auVar286._8_4_ + auVar192._8_4_) * 0.5;
  auVar283._12_4_ = (auVar286._12_4_ + auVar192._12_4_) * 0.5;
  auVar86._4_4_ = auVar283._0_4_;
  auVar86._0_4_ = auVar283._0_4_;
  auVar86._8_4_ = auVar283._0_4_;
  auVar86._12_4_ = auVar283._0_4_;
  auVar102 = vfmadd213ps_fma(auVar15,auVar86,auVar20);
  auVar108 = vfmadd213ps_fma(local_390,auVar86,auVar21);
  auVar147 = vfmadd213ps_fma(local_3a0,auVar86,auVar186);
  auVar19 = vsubps_avx(auVar108,auVar102);
  auVar102 = vfmadd213ps_fma(auVar19,auVar86,auVar102);
  auVar19 = vsubps_avx(auVar147,auVar108);
  auVar19 = vfmadd213ps_fma(auVar19,auVar86,auVar108);
  auVar19 = vsubps_avx(auVar19,auVar102);
  auVar102 = vfmadd231ps_fma(auVar102,auVar19,auVar86);
  auVar87._0_8_ = CONCAT44(auVar19._4_4_ * 3.0,auVar19._0_4_ * 3.0);
  auVar87._8_4_ = auVar19._8_4_ * 3.0;
  auVar87._12_4_ = auVar19._12_4_ * 3.0;
  auVar319._8_8_ = auVar102._0_8_;
  auVar319._0_8_ = auVar102._0_8_;
  auVar19 = vshufpd_avx(auVar102,auVar102,3);
  auVar102 = vshufps_avx(auVar283,auVar283,0x55);
  auVar281 = vsubps_avx(auVar19,auVar319);
  auVar243 = vfmadd231ps_fma(auVar319,auVar102,auVar281);
  auVar329._8_8_ = auVar87._0_8_;
  auVar329._0_8_ = auVar87._0_8_;
  auVar19 = vshufpd_avx(auVar87,auVar87,3);
  auVar19 = vsubps_avx(auVar19,auVar329);
  auVar242 = vfmadd213ps_fma(auVar19,auVar102,auVar329);
  auVar102 = vmovshdup_avx(auVar242);
  auVar330._0_8_ = auVar102._0_8_ ^ 0x8000000080000000;
  auVar330._8_4_ = auVar102._8_4_ ^ 0x80000000;
  auVar330._12_4_ = auVar102._12_4_ ^ 0x80000000;
  auVar108 = vmovshdup_avx(auVar281);
  auVar19 = vunpcklps_avx(auVar108,auVar330);
  auVar147 = vshufps_avx(auVar19,auVar330,4);
  auVar201 = vshufps_avx(auVar283,auVar283,0x54);
  auVar158._0_8_ = auVar281._0_8_ ^ 0x8000000080000000;
  auVar158._8_4_ = auVar281._8_4_ ^ 0x80000000;
  auVar158._12_4_ = auVar281._12_4_ ^ 0x80000000;
  auVar19 = vmovlhps_avx(auVar158,auVar242);
  auVar19 = vshufps_avx(auVar19,auVar242,8);
  auVar102 = vfmsub231ss_fma(ZEXT416((uint)(auVar281._0_4_ * auVar102._0_4_)),auVar108,auVar242);
  uVar67 = auVar102._0_4_;
  auVar88._4_4_ = uVar67;
  auVar88._0_4_ = uVar67;
  auVar88._8_4_ = uVar67;
  auVar88._12_4_ = uVar67;
  auVar102 = vdivps_avx(auVar147,auVar88);
  auVar108 = vdivps_avx(auVar19,auVar88);
  fVar145 = auVar243._0_4_;
  fVar146 = auVar102._0_4_;
  auVar19 = vshufps_avx(auVar243,auVar243,0x55);
  fVar96 = auVar108._0_4_;
  auVar89._0_4_ = fVar145 * fVar146 + auVar19._0_4_ * fVar96;
  auVar89._4_4_ = fVar145 * auVar102._4_4_ + auVar19._4_4_ * auVar108._4_4_;
  auVar89._8_4_ = fVar145 * auVar102._8_4_ + auVar19._8_4_ * auVar108._8_4_;
  auVar89._12_4_ = fVar145 * auVar102._12_4_ + auVar19._12_4_ * auVar108._12_4_;
  auVar296 = vsubps_avx(auVar201,auVar89);
  auVar201 = vmovshdup_avx(auVar102);
  auVar19 = vinsertps_avx(auVar271,auVar304,0x1c);
  auVar193._0_4_ = auVar201._0_4_ * auVar19._0_4_;
  auVar193._4_4_ = auVar201._4_4_ * auVar19._4_4_;
  auVar193._8_4_ = auVar201._8_4_ * auVar19._8_4_;
  auVar193._12_4_ = auVar201._12_4_ * auVar19._12_4_;
  auVar147 = vinsertps_avx(auVar260,auVar287,0x1c);
  auVar117._0_4_ = auVar147._0_4_ * auVar201._0_4_;
  auVar117._4_4_ = auVar147._4_4_ * auVar201._4_4_;
  auVar117._8_4_ = auVar147._8_4_ * auVar201._8_4_;
  auVar117._12_4_ = auVar147._12_4_ * auVar201._12_4_;
  auVar243 = vminps_avx(auVar193,auVar117);
  auVar242 = vmaxps_avx(auVar117,auVar193);
  auVar201 = vinsertps_avx(auVar304,auVar271,0x4c);
  auVar154 = vmovshdup_avx(auVar108);
  auVar281 = vinsertps_avx(auVar287,auVar260,0x4c);
  auVar288._0_4_ = auVar154._0_4_ * auVar201._0_4_;
  auVar288._4_4_ = auVar154._4_4_ * auVar201._4_4_;
  auVar288._8_4_ = auVar154._8_4_ * auVar201._8_4_;
  auVar288._12_4_ = auVar154._12_4_ * auVar201._12_4_;
  auVar272._0_4_ = auVar154._0_4_ * auVar281._0_4_;
  auVar272._4_4_ = auVar154._4_4_ * auVar281._4_4_;
  auVar272._8_4_ = auVar154._8_4_ * auVar281._8_4_;
  auVar272._12_4_ = auVar154._12_4_ * auVar281._12_4_;
  auVar154 = vminps_avx(auVar288,auVar272);
  auVar305._0_4_ = auVar243._0_4_ + auVar154._0_4_;
  auVar305._4_4_ = auVar243._4_4_ + auVar154._4_4_;
  auVar305._8_4_ = auVar243._8_4_ + auVar154._8_4_;
  auVar305._12_4_ = auVar243._12_4_ + auVar154._12_4_;
  auVar243 = vmaxps_avx(auVar272,auVar288);
  auVar118._0_4_ = auVar243._0_4_ + auVar242._0_4_;
  auVar118._4_4_ = auVar243._4_4_ + auVar242._4_4_;
  auVar118._8_4_ = auVar243._8_4_ + auVar242._8_4_;
  auVar118._12_4_ = auVar243._12_4_ + auVar242._12_4_;
  auVar273._8_8_ = 0x3f80000000000000;
  auVar273._0_8_ = 0x3f80000000000000;
  auVar242 = vsubps_avx(auVar273,auVar118);
  auVar243 = vsubps_avx(auVar273,auVar305);
  auVar154 = vsubps_avx(auVar286,auVar283);
  auVar255 = vsubps_avx(auVar192,auVar283);
  auVar138._0_4_ = fVar146 * auVar19._0_4_;
  auVar138._4_4_ = fVar146 * auVar19._4_4_;
  auVar138._8_4_ = fVar146 * auVar19._8_4_;
  auVar138._12_4_ = fVar146 * auVar19._12_4_;
  auVar306._0_4_ = fVar146 * auVar147._0_4_;
  auVar306._4_4_ = fVar146 * auVar147._4_4_;
  auVar306._8_4_ = fVar146 * auVar147._8_4_;
  auVar306._12_4_ = fVar146 * auVar147._12_4_;
  auVar147 = vminps_avx(auVar138,auVar306);
  auVar19 = vmaxps_avx(auVar306,auVar138);
  auVar194._0_4_ = fVar96 * auVar201._0_4_;
  auVar194._4_4_ = fVar96 * auVar201._4_4_;
  auVar194._8_4_ = fVar96 * auVar201._8_4_;
  auVar194._12_4_ = fVar96 * auVar201._12_4_;
  auVar261._0_4_ = fVar96 * auVar281._0_4_;
  auVar261._4_4_ = fVar96 * auVar281._4_4_;
  auVar261._8_4_ = fVar96 * auVar281._8_4_;
  auVar261._12_4_ = fVar96 * auVar281._12_4_;
  auVar201 = vminps_avx(auVar194,auVar261);
  auVar307._0_4_ = auVar147._0_4_ + auVar201._0_4_;
  auVar307._4_4_ = auVar147._4_4_ + auVar201._4_4_;
  auVar307._8_4_ = auVar147._8_4_ + auVar201._8_4_;
  auVar307._12_4_ = auVar147._12_4_ + auVar201._12_4_;
  fVar220 = auVar154._0_4_;
  auVar320._0_4_ = fVar220 * auVar242._0_4_;
  fVar236 = auVar154._4_4_;
  auVar320._4_4_ = fVar236 * auVar242._4_4_;
  fVar237 = auVar154._8_4_;
  auVar320._8_4_ = fVar237 * auVar242._8_4_;
  fVar238 = auVar154._12_4_;
  auVar320._12_4_ = fVar238 * auVar242._12_4_;
  auVar147 = vmaxps_avx(auVar261,auVar194);
  auVar262._0_4_ = fVar220 * auVar243._0_4_;
  auVar262._4_4_ = fVar236 * auVar243._4_4_;
  auVar262._8_4_ = fVar237 * auVar243._8_4_;
  auVar262._12_4_ = fVar238 * auVar243._12_4_;
  fVar145 = auVar255._0_4_;
  auVar119._0_4_ = fVar145 * auVar242._0_4_;
  fVar128 = auVar255._4_4_;
  auVar119._4_4_ = fVar128 * auVar242._4_4_;
  fVar142 = auVar255._8_4_;
  auVar119._8_4_ = fVar142 * auVar242._8_4_;
  fVar143 = auVar255._12_4_;
  auVar119._12_4_ = fVar143 * auVar242._12_4_;
  auVar274._0_4_ = fVar145 * auVar243._0_4_;
  auVar274._4_4_ = fVar128 * auVar243._4_4_;
  auVar274._8_4_ = fVar142 * auVar243._8_4_;
  auVar274._12_4_ = fVar143 * auVar243._12_4_;
  auVar139._0_4_ = auVar19._0_4_ + auVar147._0_4_;
  auVar139._4_4_ = auVar19._4_4_ + auVar147._4_4_;
  auVar139._8_4_ = auVar19._8_4_ + auVar147._8_4_;
  auVar139._12_4_ = auVar19._12_4_ + auVar147._12_4_;
  auVar195._8_8_ = 0x3f800000;
  auVar195._0_8_ = 0x3f800000;
  auVar19 = vsubps_avx(auVar195,auVar139);
  auVar147 = vsubps_avx(auVar195,auVar307);
  auVar308._0_4_ = fVar220 * auVar19._0_4_;
  auVar308._4_4_ = fVar236 * auVar19._4_4_;
  auVar308._8_4_ = fVar237 * auVar19._8_4_;
  auVar308._12_4_ = fVar238 * auVar19._12_4_;
  auVar289._0_4_ = fVar220 * auVar147._0_4_;
  auVar289._4_4_ = fVar236 * auVar147._4_4_;
  auVar289._8_4_ = fVar237 * auVar147._8_4_;
  auVar289._12_4_ = fVar238 * auVar147._12_4_;
  auVar140._0_4_ = fVar145 * auVar19._0_4_;
  auVar140._4_4_ = fVar128 * auVar19._4_4_;
  auVar140._8_4_ = fVar142 * auVar19._8_4_;
  auVar140._12_4_ = fVar143 * auVar19._12_4_;
  auVar196._0_4_ = fVar145 * auVar147._0_4_;
  auVar196._4_4_ = fVar128 * auVar147._4_4_;
  auVar196._8_4_ = fVar142 * auVar147._8_4_;
  auVar196._12_4_ = fVar143 * auVar147._12_4_;
  auVar19 = vminps_avx(auVar308,auVar289);
  auVar147 = vminps_avx(auVar140,auVar196);
  auVar19 = vminps_avx(auVar19,auVar147);
  auVar147 = vmaxps_avx(auVar289,auVar308);
  auVar201 = vmaxps_avx(auVar196,auVar140);
  auVar281 = vminps_avx(auVar320,auVar262);
  auVar242 = vminps_avx(auVar119,auVar274);
  auVar281 = vminps_avx(auVar281,auVar242);
  auVar19 = vhaddps_avx(auVar19,auVar281);
  auVar147 = vmaxps_avx(auVar201,auVar147);
  auVar201 = vmaxps_avx(auVar262,auVar320);
  auVar281 = vmaxps_avx(auVar274,auVar119);
  auVar201 = vmaxps_avx(auVar281,auVar201);
  auVar147 = vhaddps_avx(auVar147,auVar201);
  auVar19 = vshufps_avx(auVar19,auVar19,0xe8);
  auVar147 = vshufps_avx(auVar147,auVar147,0xe8);
  auVar275._0_4_ = auVar296._0_4_ + auVar19._0_4_;
  auVar275._4_4_ = auVar296._4_4_ + auVar19._4_4_;
  auVar275._8_4_ = auVar296._8_4_ + auVar19._8_4_;
  auVar275._12_4_ = auVar296._12_4_ + auVar19._12_4_;
  auVar263._0_4_ = auVar296._0_4_ + auVar147._0_4_;
  auVar263._4_4_ = auVar296._4_4_ + auVar147._4_4_;
  auVar263._8_4_ = auVar296._8_4_ + auVar147._8_4_;
  auVar263._12_4_ = auVar296._12_4_ + auVar147._12_4_;
  auVar19 = vmaxps_avx(auVar286,auVar275);
  auVar147 = vminps_avx(auVar263,auVar192);
  auVar19 = vcmpps_avx(auVar147,auVar19,1);
  auVar19 = vshufps_avx(auVar19,auVar19,0x50);
  if ((auVar19 >> 0x3f & (undefined1  [16])0x1) != (undefined1  [16])0x0 || auVar19[0xf] < '\0')
  goto LAB_01241f4f;
  bVar60 = 0;
  if ((auVar234._0_4_ < auVar275._0_4_) && (bVar60 = 0, auVar263._0_4_ < auVar192._0_4_)) {
    auVar147 = vmovshdup_avx(auVar275);
    auVar19 = vcmpps_avx(auVar263,auVar192,1);
    bVar60 = auVar19[4] & auVar314._0_4_ < auVar147._0_4_;
  }
  if (((3 < (uint)uVar62 || fVar98 < 0.001) | bVar60) != 1) goto LAB_01242ddd;
  lVar65 = 0xc9;
  do {
    lVar65 = lVar65 + -1;
    if (lVar65 == 0) goto LAB_01241f4f;
    fVar128 = auVar296._0_4_;
    fVar145 = 1.0 - fVar128;
    fVar98 = fVar145 * fVar145 * fVar145;
    fVar95 = fVar128 * 3.0 * fVar145 * fVar145;
    fVar145 = fVar145 * fVar128 * fVar128 * 3.0;
    auVar176._4_4_ = fVar98;
    auVar176._0_4_ = fVar98;
    auVar176._8_4_ = fVar98;
    auVar176._12_4_ = fVar98;
    auVar141._4_4_ = fVar95;
    auVar141._0_4_ = fVar95;
    auVar141._8_4_ = fVar95;
    auVar141._12_4_ = fVar95;
    auVar120._4_4_ = fVar145;
    auVar120._0_4_ = fVar145;
    auVar120._8_4_ = fVar145;
    auVar120._12_4_ = fVar145;
    fVar128 = fVar128 * fVar128 * fVar128;
    auVar197._0_4_ = (float)local_3b0._0_4_ * fVar128;
    auVar197._4_4_ = (float)local_3b0._4_4_ * fVar128;
    auVar197._8_4_ = fStack_3a8 * fVar128;
    auVar197._12_4_ = fStack_3a4 * fVar128;
    auVar18 = vfmadd231ps_fma(auVar197,auVar186,auVar120);
    auVar18 = vfmadd231ps_fma(auVar18,auVar21,auVar141);
    auVar18 = vfmadd231ps_fma(auVar18,auVar20,auVar176);
    auVar121._8_8_ = auVar18._0_8_;
    auVar121._0_8_ = auVar18._0_8_;
    auVar18 = vshufpd_avx(auVar18,auVar18,3);
    auVar19 = vshufps_avx(auVar296,auVar296,0x55);
    auVar18 = vsubps_avx(auVar18,auVar121);
    auVar19 = vfmadd213ps_fma(auVar18,auVar19,auVar121);
    fVar98 = auVar19._0_4_;
    auVar18 = vshufps_avx(auVar19,auVar19,0x55);
    auVar122._0_4_ = fVar146 * fVar98 + fVar96 * auVar18._0_4_;
    auVar122._4_4_ = auVar102._4_4_ * fVar98 + auVar108._4_4_ * auVar18._4_4_;
    auVar122._8_4_ = auVar102._8_4_ * fVar98 + auVar108._8_4_ * auVar18._8_4_;
    auVar122._12_4_ = auVar102._12_4_ * fVar98 + auVar108._12_4_ * auVar18._12_4_;
    auVar296 = vsubps_avx(auVar296,auVar122);
    auVar18 = vandps_avx(auVar313,auVar19);
    auVar19 = vshufps_avx(auVar18,auVar18,0xf5);
    auVar18 = vmaxss_avx(auVar19,auVar18);
  } while ((float)local_3c0._0_4_ <= auVar18._0_4_);
  local_120 = auVar296._0_4_;
  if ((local_120 < 0.0) || (1.0 < local_120)) goto LAB_01241f4f;
  auVar18 = vmovshdup_avx(auVar296);
  fVar98 = auVar18._0_4_;
  if ((fVar98 < 0.0) || (1.0 < fVar98)) goto LAB_01241f4f;
  auVar19 = vinsertps_avx(ZEXT416((uint)pre->ray_space[k].vx.field_0.m128[2]),
                          ZEXT416((uint)pre->ray_space[k].vy.field_0.m128[2]),0x1c);
  auVar281 = vinsertps_avx(auVar19,ZEXT416((uint)pre->ray_space[k].vz.field_0.m128[2]),0x28);
  auVar19 = vdpps_avx(auVar281,auVar17,0x7f);
  auVar102 = vdpps_avx(auVar281,auVar185,0x7f);
  auVar108 = vdpps_avx(auVar281,local_3d0,0x7f);
  auVar147 = vdpps_avx(auVar281,local_3e0,0x7f);
  auVar286 = vdpps_avx(auVar281,local_3f0,0x7f);
  auVar192 = vdpps_avx(auVar281,local_400,0x7f);
  auVar201 = vdpps_avx(auVar281,local_410,0x7f);
  auVar281 = vdpps_avx(auVar281,local_420,0x7f);
  fVar95 = 1.0 - fVar98;
  auVar19 = vfmadd231ss_fma(ZEXT416((uint)(fVar98 * auVar286._0_4_)),ZEXT416((uint)fVar95),auVar19);
  auVar102 = vfmadd231ss_fma(ZEXT416((uint)(auVar192._0_4_ * fVar98)),ZEXT416((uint)fVar95),auVar102
                            );
  auVar108 = vfmadd231ss_fma(ZEXT416((uint)(auVar201._0_4_ * fVar98)),ZEXT416((uint)fVar95),auVar108
                            );
  auVar147 = vfmadd231ss_fma(ZEXT416((uint)(fVar98 * auVar281._0_4_)),ZEXT416((uint)fVar95),auVar147
                            );
  fVar96 = 1.0 - local_120;
  fVar98 = fVar96 * local_120 * local_120 * 3.0;
  fVar128 = local_120 * local_120 * local_120;
  auVar108 = vfmadd231ss_fma(ZEXT416((uint)(fVar128 * auVar147._0_4_)),ZEXT416((uint)fVar98),
                             auVar108);
  fVar95 = local_120 * 3.0 * fVar96 * fVar96;
  auVar102 = vfmadd231ss_fma(auVar108,ZEXT416((uint)fVar95),auVar102);
  fVar146 = fVar96 * fVar96 * fVar96;
  auVar19 = vfmadd231ss_fma(auVar102,ZEXT416((uint)fVar146),auVar19);
  fVar145 = auVar19._0_4_;
  if ((fVar145 < fVar69) || (fVar142 = *(float *)(ray + k * 4 + 0x100), fVar142 < fVar145))
  goto LAB_01241f4f;
  pGVar8 = (context->scene->geometries).items[uVar57].ptr;
  if ((pGVar8->mask & *(uint *)(ray + k * 4 + 0x120)) != 0) {
    if ((context->args->filter == (RTCFilterFunctionN)0x0) &&
       (bVar60 = 1, pGVar8->occlusionFilterN == (RTCFilterFunctionN)0x0)) goto LAB_01242d81;
    auVar19 = vshufps_avx(auVar296,auVar296,0x55);
    auVar264._8_4_ = 0x3f800000;
    auVar264._0_8_ = 0x3f8000003f800000;
    auVar264._12_4_ = 0x3f800000;
    auVar102 = vsubps_avx(auVar264,auVar19);
    local_550 = auVar71._0_4_;
    fStack_54c = auVar71._4_4_;
    fStack_548 = auVar71._8_4_;
    fStack_544 = auVar71._12_4_;
    fVar143 = auVar19._0_4_;
    auVar276._0_4_ = fVar143 * local_550;
    fVar220 = auVar19._4_4_;
    auVar276._4_4_ = fVar220 * fStack_54c;
    fVar236 = auVar19._8_4_;
    auVar276._8_4_ = fVar236 * fStack_548;
    fVar237 = auVar19._12_4_;
    auVar276._12_4_ = fVar237 * fStack_544;
    local_5b0 = auVar70._0_4_;
    fStack_5ac = auVar70._4_4_;
    fStack_5a8 = auVar70._8_4_;
    fStack_5a4 = auVar70._12_4_;
    auVar284._0_4_ = fVar143 * local_5b0;
    auVar284._4_4_ = fVar220 * fStack_5ac;
    auVar284._8_4_ = fVar236 * fStack_5a8;
    auVar284._12_4_ = fVar237 * fStack_5a4;
    local_560 = auVar100._0_4_;
    fStack_55c = auVar100._4_4_;
    fStack_558 = auVar100._8_4_;
    fStack_554 = auVar100._12_4_;
    auVar290._0_4_ = fVar143 * local_560;
    auVar290._4_4_ = fVar220 * fStack_55c;
    auVar290._8_4_ = fVar236 * fStack_558;
    auVar290._12_4_ = fVar237 * fStack_554;
    local_5c0 = auVar101._0_4_;
    fStack_5bc = auVar101._4_4_;
    fStack_5b8 = auVar101._8_4_;
    fStack_5b4 = auVar101._12_4_;
    auVar250._0_4_ = fVar143 * local_5c0;
    auVar250._4_4_ = fVar220 * fStack_5bc;
    auVar250._8_4_ = fVar236 * fStack_5b8;
    auVar250._12_4_ = fVar237 * fStack_5b4;
    auVar19 = vfmadd231ps_fma(auVar276,auVar102,auVar23);
    auVar108 = vfmadd231ps_fma(auVar284,auVar102,auVar165);
    auVar147 = vfmadd231ps_fma(auVar290,auVar102,auVar22);
    auVar286 = vfmadd231ps_fma(auVar250,auVar102,auVar187);
    auVar19 = vsubps_avx(auVar108,auVar19);
    auVar102 = vsubps_avx(auVar147,auVar108);
    auVar108 = vsubps_avx(auVar286,auVar147);
    auVar291._0_4_ = local_120 * auVar102._0_4_;
    auVar291._4_4_ = local_120 * auVar102._4_4_;
    auVar291._8_4_ = local_120 * auVar102._8_4_;
    auVar291._12_4_ = local_120 * auVar102._12_4_;
    auVar231._4_4_ = fVar96;
    auVar231._0_4_ = fVar96;
    auVar231._8_4_ = fVar96;
    auVar231._12_4_ = fVar96;
    auVar19 = vfmadd231ps_fma(auVar291,auVar231,auVar19);
    auVar251._0_4_ = local_120 * auVar108._0_4_;
    auVar251._4_4_ = local_120 * auVar108._4_4_;
    auVar251._8_4_ = local_120 * auVar108._8_4_;
    auVar251._12_4_ = local_120 * auVar108._12_4_;
    auVar102 = vfmadd231ps_fma(auVar251,auVar231,auVar102);
    auVar252._0_4_ = local_120 * auVar102._0_4_;
    auVar252._4_4_ = local_120 * auVar102._4_4_;
    auVar252._8_4_ = local_120 * auVar102._8_4_;
    auVar252._12_4_ = local_120 * auVar102._12_4_;
    auVar102 = vfmadd231ps_fma(auVar252,auVar231,auVar19);
    auVar216._0_4_ = fVar128 * (float)local_480._0_4_;
    auVar216._4_4_ = fVar128 * (float)local_480._4_4_;
    auVar216._8_4_ = fVar128 * fStack_478;
    auVar216._12_4_ = fVar128 * fStack_474;
    auVar159._4_4_ = fVar98;
    auVar159._0_4_ = fVar98;
    auVar159._8_4_ = fVar98;
    auVar159._12_4_ = fVar98;
    auVar19 = vfmadd132ps_fma(auVar159,auVar216,local_470);
    auVar198._4_4_ = fVar95;
    auVar198._0_4_ = fVar95;
    auVar198._8_4_ = fVar95;
    auVar198._12_4_ = fVar95;
    auVar19 = vfmadd132ps_fma(auVar198,auVar19,local_460);
    auVar160._0_4_ = auVar102._0_4_ * 3.0;
    auVar160._4_4_ = auVar102._4_4_ * 3.0;
    auVar160._8_4_ = auVar102._8_4_ * 3.0;
    auVar160._12_4_ = auVar102._12_4_ * 3.0;
    auVar177._4_4_ = fVar146;
    auVar177._0_4_ = fVar146;
    auVar177._8_4_ = fVar146;
    auVar177._12_4_ = fVar146;
    auVar102 = vfmadd132ps_fma(auVar177,auVar19,local_450);
    auVar19 = vshufps_avx(auVar160,auVar160,0xc9);
    auVar199._0_4_ = auVar102._0_4_ * auVar19._0_4_;
    auVar199._4_4_ = auVar102._4_4_ * auVar19._4_4_;
    auVar199._8_4_ = auVar102._8_4_ * auVar19._8_4_;
    auVar199._12_4_ = auVar102._12_4_ * auVar19._12_4_;
    auVar19 = vshufps_avx(auVar102,auVar102,0xc9);
    auVar102 = vfmsub231ps_fma(auVar199,auVar160,auVar19);
    auVar19 = vmovshdup_avx(auVar102);
    local_180 = auVar19._0_8_;
    uStack_178 = local_180;
    uStack_170 = local_180;
    uStack_168 = local_180;
    auVar19 = vshufps_avx(auVar102,auVar102,0xaa);
    local_160 = auVar19._0_8_;
    uStack_158 = local_160;
    uStack_150 = local_160;
    uStack_148 = local_160;
    local_140 = auVar102._0_4_;
    uStack_13c = local_140;
    uStack_138 = local_140;
    uStack_134 = local_140;
    uStack_130 = local_140;
    uStack_12c = local_140;
    uStack_128 = local_140;
    uStack_124 = local_140;
    fStack_11c = local_120;
    fStack_118 = local_120;
    fStack_114 = local_120;
    fStack_110 = local_120;
    fStack_10c = local_120;
    fStack_108 = local_120;
    fStack_104 = local_120;
    local_100 = auVar18._0_8_;
    uStack_f8 = local_100;
    uStack_f0 = local_100;
    uStack_e8 = local_100;
    local_e0 = CONCAT44(uStack_33c,local_340);
    uStack_d8 = CONCAT44(uStack_334,uStack_338);
    uStack_d0 = CONCAT44(uStack_32c,uStack_330);
    uStack_c8 = CONCAT44(uStack_324,uStack_328);
    local_c0._4_4_ = uStack_31c;
    local_c0._0_4_ = local_320;
    local_c0._8_4_ = uStack_318;
    local_c0._12_4_ = uStack_314;
    local_c0._16_4_ = uStack_310;
    local_c0._20_4_ = uStack_30c;
    local_c0._24_4_ = uStack_308;
    local_c0._28_4_ = uStack_304;
    vpcmpeqd_avx2(local_c0,local_c0);
    uStack_9c = context->user->instID[0];
    local_a0 = uStack_9c;
    uStack_98 = uStack_9c;
    uStack_94 = uStack_9c;
    uStack_90 = uStack_9c;
    uStack_8c = uStack_9c;
    uStack_88 = uStack_9c;
    uStack_84 = uStack_9c;
    uStack_7c = context->user->instPrimID[0];
    local_80 = uStack_7c;
    uStack_78 = uStack_7c;
    uStack_74 = uStack_7c;
    uStack_70 = uStack_7c;
    uStack_6c = uStack_7c;
    uStack_68 = uStack_7c;
    uStack_64 = uStack_7c;
    *(float *)(ray + k * 4 + 0x100) = fVar145;
    local_4a0 = local_360;
    local_4d0.valid = (int *)local_4a0;
    local_4d0.geometryUserPtr = pGVar8->userPtr;
    local_4d0.context = context->user;
    local_4d0.ray = (RTCRayN *)ray;
    local_4d0.hit = (RTCHitN *)&local_180;
    local_4d0.N = 8;
    if (pGVar8->occlusionFilterN != (RTCFilterFunctionN)0x0) {
      (*pGVar8->occlusionFilterN)(&local_4d0);
    }
    auVar91 = vpcmpeqd_avx2(local_4a0,_DAT_01f7b000);
    auVar91 = _DAT_01f7b020 & ~auVar91;
    if ((((((((auVar91 >> 0x1f & (undefined1  [32])0x1) != (undefined1  [32])0x0 ||
             (auVar91 >> 0x3f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
            (auVar91 >> 0x5f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
           SUB321(auVar91 >> 0x7f,0) != '\0') ||
          (auVar91 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
         SUB321(auVar91 >> 0xbf,0) != '\0') ||
        (auVar91 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) || auVar91[0x1f] < '\0')
    {
      p_Var14 = context->args->filter;
      if ((p_Var14 != (RTCFilterFunctionN)0x0) &&
         (((context->args->flags & RTC_RAY_QUERY_FLAG_INVOKE_ARGUMENT_FILTER) !=
           RTC_RAY_QUERY_FLAG_INCOHERENT || (((pGVar8->field_8).field_0x2 & 0x40) != 0)))) {
        (*p_Var14)(&local_4d0);
      }
      auVar25 = vpcmpeqd_avx2(local_4a0,_DAT_01f7b000);
      auVar127._8_4_ = 0xff800000;
      auVar127._0_8_ = 0xff800000ff800000;
      auVar127._12_4_ = 0xff800000;
      auVar127._16_4_ = 0xff800000;
      auVar127._20_4_ = 0xff800000;
      auVar127._24_4_ = 0xff800000;
      auVar127._28_4_ = 0xff800000;
      auVar91 = vblendvps_avx(auVar127,*(undefined1 (*) [32])(local_4d0.ray + 0x100),auVar25);
      *(undefined1 (*) [32])(local_4d0.ray + 0x100) = auVar91;
      auVar91 = _DAT_01f7b020 & ~auVar25;
      if ((((((((auVar91 >> 0x1f & (undefined1  [32])0x1) != (undefined1  [32])0x0 ||
               (auVar91 >> 0x3f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
              (auVar91 >> 0x5f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
             SUB321(auVar91 >> 0x7f,0) != '\0') ||
            (auVar91 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
           SUB321(auVar91 >> 0xbf,0) != '\0') ||
          (auVar91 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
          auVar91[0x1f] < '\0') {
        bVar60 = 1;
        goto LAB_01242d81;
      }
    }
    *(float *)(ray + k * 4 + 0x100) = fVar142;
  }
  bVar60 = 0;
LAB_01242d81:
  bVar68 = (bool)(bVar68 | bVar60);
  goto LAB_01241f4f;
LAB_01242ddd:
  local_430 = vinsertps_avx(auVar18,ZEXT416((uint)fVar95),0x10);
  auVar78 = vinsertps_avx(auVar314,ZEXT416((uint)auVar323._0_4_),0x10);
  goto LAB_0124199e;
}

Assistant:

static __forceinline bool occluded_n(Precalculations& pre, RayK<K>& ray, const size_t k, RayQueryContext* context, const Primitive& prim)
      {
        vfloat<M> tNear;
        vbool<M> valid = intersect(ray,k,prim,tNear);

        const size_t N = prim.N;
        size_t mask = movemask(valid);
        while (mask)
        {
          const size_t i = bscf(mask);
          STAT3(shadow.trav_prims,1,1,1);
          const unsigned int geomID = prim.geomID(N);
          const unsigned int primID = prim.primID(N)[i];
          const CurveGeometry* geom = context->scene->get<CurveGeometry>(geomID);
          const Vec3fa ray_org(ray.org.x[k], ray.org.y[k], ray.org.z[k]);
          const TensorLinearCubicBezierSurface3fa curve = geom->getNormalOrientedCurve<typename Intersector::SourceCurve3ff, typename Intersector::SourceCurve3fa, TensorLinearCubicBezierSurface3fa>(context, ray_org, primID,ray.time()[k]);
          
          if (Intersector().intersect(pre,ray,k,context,geom,primID,curve,Epilog(ray,k,context,geomID,primID)))
            return true;

          mask &= movemask(tNear <= vfloat<M>(ray.tfar[k]));
        }
        return false;
      }